

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx512::CurveNvIntersectorK<8,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  int iVar9;
  undefined4 uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  code *pcVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined8 uVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  long lVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  byte bVar90;
  byte bVar91;
  ulong uVar92;
  uint uVar93;
  uint uVar94;
  ulong uVar95;
  ulong uVar96;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar102;
  undefined1 auVar110 [16];
  long lVar97;
  uint uVar98;
  ulong uVar99;
  byte bVar100;
  float fVar101;
  float fVar155;
  float fVar156;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar109 [16];
  float fVar157;
  float fVar159;
  float fVar160;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar158;
  float fVar161;
  float fVar162;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar163;
  undefined4 uVar164;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined8 uVar165;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar184;
  float fVar185;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar191;
  undefined1 auVar190 [64];
  float fVar192;
  float fVar206;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar205;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  uint uVar219;
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [16];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  RTCFilterFunctionNArguments local_740;
  long local_710;
  undefined1 (*local_708) [32];
  undefined1 local_700 [32];
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined4 local_5d0;
  undefined4 uStack_5cc;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  uint local_5a0;
  uint uStack_59c;
  uint uStack_598;
  uint uStack_594;
  uint uStack_590;
  uint uStack_58c;
  uint uStack_588;
  uint uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined4 local_480;
  int local_47c;
  undefined1 local_470 [16];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  byte local_430;
  float local_420 [4];
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined8 local_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  int local_2e0;
  int iStack_2dc;
  int iStack_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int iStack_2c8;
  int iStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  uint local_200;
  uint uStack_1fc;
  uint uStack_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar8 = prim[1];
  uVar96 = (ulong)(byte)PVar8;
  lVar75 = uVar96 * 0x19;
  fVar192 = *(float *)(prim + lVar75 + 0x12);
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar107 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar108 = vsubps_avx(auVar21,*(undefined1 (*) [16])(prim + lVar75 + 6));
  fVar184 = fVar192 * auVar108._0_4_;
  fVar163 = fVar192 * auVar107._0_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar96 * 4 + 6);
  auVar116 = vpmovsxbd_avx2(auVar21);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar96 * 5 + 6);
  auVar114 = vpmovsxbd_avx2(auVar106);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar96 * 6 + 6);
  auVar126 = vpmovsxbd_avx2(auVar105);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar96 * 0xb + 6);
  auVar127 = vpmovsxbd_avx2(auVar103);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6);
  auVar123 = vpmovsxbd_avx2(auVar110);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar125 = vcvtdq2ps_avx(auVar123);
  auVar233._8_8_ = 0;
  auVar233._0_8_ = *(ulong *)(prim + (uint)(byte)PVar8 * 0xc + uVar96 + 6);
  auVar115 = vpmovsxbd_avx2(auVar233);
  auVar115 = vcvtdq2ps_avx(auVar115);
  uVar99 = (ulong)(uint)((int)(uVar96 * 9) * 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar99 + 6);
  auVar117 = vpmovsxbd_avx2(auVar6);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar99 + uVar96 + 6);
  auVar118 = vpmovsxbd_avx2(auVar7);
  auVar118 = vcvtdq2ps_avx(auVar118);
  uVar92 = (ulong)(uint)((int)(uVar96 * 5) << 2);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar92 + 6);
  auVar113 = vpmovsxbd_avx2(auVar104);
  auVar124 = vcvtdq2ps_avx(auVar113);
  auVar224._4_4_ = fVar163;
  auVar224._0_4_ = fVar163;
  auVar224._8_4_ = fVar163;
  auVar224._12_4_ = fVar163;
  auVar224._16_4_ = fVar163;
  auVar224._20_4_ = fVar163;
  auVar224._24_4_ = fVar163;
  auVar224._28_4_ = fVar163;
  auVar226._8_4_ = 1;
  auVar226._0_8_ = 0x100000001;
  auVar226._12_4_ = 1;
  auVar226._16_4_ = 1;
  auVar226._20_4_ = 1;
  auVar226._24_4_ = 1;
  auVar226._28_4_ = 1;
  auVar111 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar120 = ZEXT1632(CONCAT412(fVar192 * auVar107._12_4_,
                                CONCAT48(fVar192 * auVar107._8_4_,
                                         CONCAT44(fVar192 * auVar107._4_4_,fVar163))));
  auVar119 = vpermps_avx2(auVar226,auVar120);
  auVar112 = vpermps_avx512vl(auVar111,auVar120);
  fVar163 = auVar112._0_4_;
  fVar205 = auVar112._4_4_;
  auVar120._4_4_ = fVar205 * auVar126._4_4_;
  auVar120._0_4_ = fVar163 * auVar126._0_4_;
  fVar206 = auVar112._8_4_;
  auVar120._8_4_ = fVar206 * auVar126._8_4_;
  fVar185 = auVar112._12_4_;
  auVar120._12_4_ = fVar185 * auVar126._12_4_;
  fVar191 = auVar112._16_4_;
  auVar120._16_4_ = fVar191 * auVar126._16_4_;
  fVar101 = auVar112._20_4_;
  auVar120._20_4_ = fVar101 * auVar126._20_4_;
  fVar102 = auVar112._24_4_;
  auVar120._24_4_ = fVar102 * auVar126._24_4_;
  auVar120._28_4_ = auVar123._28_4_;
  auVar123._4_4_ = auVar115._4_4_ * fVar205;
  auVar123._0_4_ = auVar115._0_4_ * fVar163;
  auVar123._8_4_ = auVar115._8_4_ * fVar206;
  auVar123._12_4_ = auVar115._12_4_ * fVar185;
  auVar123._16_4_ = auVar115._16_4_ * fVar191;
  auVar123._20_4_ = auVar115._20_4_ * fVar101;
  auVar123._24_4_ = auVar115._24_4_ * fVar102;
  auVar123._28_4_ = auVar113._28_4_;
  auVar113._4_4_ = auVar124._4_4_ * fVar205;
  auVar113._0_4_ = auVar124._0_4_ * fVar163;
  auVar113._8_4_ = auVar124._8_4_ * fVar206;
  auVar113._12_4_ = auVar124._12_4_ * fVar185;
  auVar113._16_4_ = auVar124._16_4_ * fVar191;
  auVar113._20_4_ = auVar124._20_4_ * fVar101;
  auVar113._24_4_ = auVar124._24_4_ * fVar102;
  auVar113._28_4_ = auVar112._28_4_;
  auVar21 = vfmadd231ps_fma(auVar120,auVar119,auVar114);
  auVar106 = vfmadd231ps_fma(auVar123,auVar119,auVar125);
  auVar105 = vfmadd231ps_fma(auVar113,auVar118,auVar119);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar224,auVar116);
  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar224,auVar127);
  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar117,auVar224);
  auVar225._4_4_ = fVar184;
  auVar225._0_4_ = fVar184;
  auVar225._8_4_ = fVar184;
  auVar225._12_4_ = fVar184;
  auVar225._16_4_ = fVar184;
  auVar225._20_4_ = fVar184;
  auVar225._24_4_ = fVar184;
  auVar225._28_4_ = fVar184;
  auVar113 = ZEXT1632(CONCAT412(fVar192 * auVar108._12_4_,
                                CONCAT48(fVar192 * auVar108._8_4_,
                                         CONCAT44(fVar192 * auVar108._4_4_,fVar184))));
  auVar123 = vpermps_avx2(auVar226,auVar113);
  auVar113 = vpermps_avx512vl(auVar111,auVar113);
  fVar192 = auVar113._0_4_;
  fVar163 = auVar113._4_4_;
  auVar119._4_4_ = fVar163 * auVar126._4_4_;
  auVar119._0_4_ = fVar192 * auVar126._0_4_;
  fVar205 = auVar113._8_4_;
  auVar119._8_4_ = fVar205 * auVar126._8_4_;
  fVar206 = auVar113._12_4_;
  auVar119._12_4_ = fVar206 * auVar126._12_4_;
  fVar185 = auVar113._16_4_;
  auVar119._16_4_ = fVar185 * auVar126._16_4_;
  fVar191 = auVar113._20_4_;
  auVar119._20_4_ = fVar191 * auVar126._20_4_;
  fVar101 = auVar113._24_4_;
  auVar119._24_4_ = fVar101 * auVar126._24_4_;
  auVar119._28_4_ = 1;
  auVar111._4_4_ = auVar115._4_4_ * fVar163;
  auVar111._0_4_ = auVar115._0_4_ * fVar192;
  auVar111._8_4_ = auVar115._8_4_ * fVar205;
  auVar111._12_4_ = auVar115._12_4_ * fVar206;
  auVar111._16_4_ = auVar115._16_4_ * fVar185;
  auVar111._20_4_ = auVar115._20_4_ * fVar191;
  auVar111._24_4_ = auVar115._24_4_ * fVar101;
  auVar111._28_4_ = auVar126._28_4_;
  auVar115._4_4_ = auVar124._4_4_ * fVar163;
  auVar115._0_4_ = auVar124._0_4_ * fVar192;
  auVar115._8_4_ = auVar124._8_4_ * fVar205;
  auVar115._12_4_ = auVar124._12_4_ * fVar206;
  auVar115._16_4_ = auVar124._16_4_ * fVar185;
  auVar115._20_4_ = auVar124._20_4_ * fVar191;
  auVar115._24_4_ = auVar124._24_4_ * fVar101;
  auVar115._28_4_ = auVar113._28_4_;
  auVar103 = vfmadd231ps_fma(auVar119,auVar123,auVar114);
  auVar110 = vfmadd231ps_fma(auVar111,auVar123,auVar125);
  auVar233 = vfmadd231ps_fma(auVar115,auVar123,auVar118);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar225,auVar116);
  auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar225,auVar127);
  auVar216._8_4_ = 0x7fffffff;
  auVar216._0_8_ = 0x7fffffff7fffffff;
  auVar216._12_4_ = 0x7fffffff;
  auVar216._16_4_ = 0x7fffffff;
  auVar216._20_4_ = 0x7fffffff;
  auVar216._24_4_ = 0x7fffffff;
  auVar216._28_4_ = 0x7fffffff;
  auVar233 = vfmadd231ps_fma(ZEXT1632(auVar233),auVar225,auVar117);
  auVar116 = vandps_avx(ZEXT1632(auVar21),auVar216);
  auVar213._8_4_ = 0x219392ef;
  auVar213._0_8_ = 0x219392ef219392ef;
  auVar213._12_4_ = 0x219392ef;
  auVar213._16_4_ = 0x219392ef;
  auVar213._20_4_ = 0x219392ef;
  auVar213._24_4_ = 0x219392ef;
  auVar213._28_4_ = 0x219392ef;
  uVar99 = vcmpps_avx512vl(auVar116,auVar213,1);
  bVar14 = (bool)((byte)uVar99 & 1);
  auVar112._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar21._0_4_;
  bVar14 = (bool)((byte)(uVar99 >> 1) & 1);
  auVar112._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar21._4_4_;
  bVar14 = (bool)((byte)(uVar99 >> 2) & 1);
  auVar112._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar21._8_4_;
  bVar14 = (bool)((byte)(uVar99 >> 3) & 1);
  auVar112._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar21._12_4_;
  auVar112._16_4_ = (uint)((byte)(uVar99 >> 4) & 1) * 0x219392ef;
  auVar112._20_4_ = (uint)((byte)(uVar99 >> 5) & 1) * 0x219392ef;
  auVar112._24_4_ = (uint)((byte)(uVar99 >> 6) & 1) * 0x219392ef;
  auVar112._28_4_ = (uint)(byte)(uVar99 >> 7) * 0x219392ef;
  auVar116 = vandps_avx(ZEXT1632(auVar106),auVar216);
  uVar99 = vcmpps_avx512vl(auVar116,auVar213,1);
  bVar14 = (bool)((byte)uVar99 & 1);
  auVar121._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar106._0_4_;
  bVar14 = (bool)((byte)(uVar99 >> 1) & 1);
  auVar121._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar106._4_4_;
  bVar14 = (bool)((byte)(uVar99 >> 2) & 1);
  auVar121._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar106._8_4_;
  bVar14 = (bool)((byte)(uVar99 >> 3) & 1);
  auVar121._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar106._12_4_;
  auVar121._16_4_ = (uint)((byte)(uVar99 >> 4) & 1) * 0x219392ef;
  auVar121._20_4_ = (uint)((byte)(uVar99 >> 5) & 1) * 0x219392ef;
  auVar121._24_4_ = (uint)((byte)(uVar99 >> 6) & 1) * 0x219392ef;
  auVar121._28_4_ = (uint)(byte)(uVar99 >> 7) * 0x219392ef;
  auVar116 = vandps_avx(ZEXT1632(auVar105),auVar216);
  uVar99 = vcmpps_avx512vl(auVar116,auVar213,1);
  bVar14 = (bool)((byte)uVar99 & 1);
  auVar116._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar105._0_4_;
  bVar14 = (bool)((byte)(uVar99 >> 1) & 1);
  auVar116._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar105._4_4_;
  bVar14 = (bool)((byte)(uVar99 >> 2) & 1);
  auVar116._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar105._8_4_;
  bVar14 = (bool)((byte)(uVar99 >> 3) & 1);
  auVar116._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar105._12_4_;
  auVar116._16_4_ = (uint)((byte)(uVar99 >> 4) & 1) * 0x219392ef;
  auVar116._20_4_ = (uint)((byte)(uVar99 >> 5) & 1) * 0x219392ef;
  auVar116._24_4_ = (uint)((byte)(uVar99 >> 6) & 1) * 0x219392ef;
  auVar116._28_4_ = (uint)(byte)(uVar99 >> 7) * 0x219392ef;
  auVar114 = vrcp14ps_avx512vl(auVar112);
  auVar214._8_4_ = 0x3f800000;
  auVar214._0_8_ = &DAT_3f8000003f800000;
  auVar214._12_4_ = 0x3f800000;
  auVar214._16_4_ = 0x3f800000;
  auVar214._20_4_ = 0x3f800000;
  auVar214._24_4_ = 0x3f800000;
  auVar214._28_4_ = 0x3f800000;
  auVar21 = vfnmadd213ps_fma(auVar112,auVar114,auVar214);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar114,auVar114);
  auVar114 = vrcp14ps_avx512vl(auVar121);
  auVar106 = vfnmadd213ps_fma(auVar121,auVar114,auVar214);
  auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar114,auVar114);
  auVar114 = vrcp14ps_avx512vl(auVar116);
  auVar105 = vfnmadd213ps_fma(auVar116,auVar114,auVar214);
  auVar105 = vfmadd132ps_fma(ZEXT1632(auVar105),auVar114,auVar114);
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar96 * 7 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,ZEXT1632(auVar103));
  auVar117._4_4_ = auVar21._4_4_ * auVar116._4_4_;
  auVar117._0_4_ = auVar21._0_4_ * auVar116._0_4_;
  auVar117._8_4_ = auVar21._8_4_ * auVar116._8_4_;
  auVar117._12_4_ = auVar21._12_4_ * auVar116._12_4_;
  auVar117._16_4_ = auVar116._16_4_ * 0.0;
  auVar117._20_4_ = auVar116._20_4_ * 0.0;
  auVar117._24_4_ = auVar116._24_4_ * 0.0;
  auVar117._28_4_ = auVar116._28_4_;
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar96 * 9 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,ZEXT1632(auVar103));
  auVar115 = vpbroadcastd_avx512vl();
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar140._0_4_ = auVar21._0_4_ * auVar116._0_4_;
  auVar140._4_4_ = auVar21._4_4_ * auVar116._4_4_;
  auVar140._8_4_ = auVar21._8_4_ * auVar116._8_4_;
  auVar140._12_4_ = auVar21._12_4_ * auVar116._12_4_;
  auVar140._16_4_ = auVar116._16_4_ * 0.0;
  auVar140._20_4_ = auVar116._20_4_ * 0.0;
  auVar140._24_4_ = auVar116._24_4_ * 0.0;
  auVar140._28_4_ = 0;
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar8 * 0x10 + uVar96 * -2 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,ZEXT1632(auVar110));
  auVar118._4_4_ = auVar106._4_4_ * auVar116._4_4_;
  auVar118._0_4_ = auVar106._0_4_ * auVar116._0_4_;
  auVar118._8_4_ = auVar106._8_4_ * auVar116._8_4_;
  auVar118._12_4_ = auVar106._12_4_ * auVar116._12_4_;
  auVar118._16_4_ = auVar116._16_4_ * 0.0;
  auVar118._20_4_ = auVar116._20_4_ * 0.0;
  auVar118._24_4_ = auVar116._24_4_ * 0.0;
  auVar118._28_4_ = auVar116._28_4_;
  auVar215 = ZEXT3264(auVar118);
  auVar116 = vcvtdq2ps_avx(auVar114);
  auVar116 = vsubps_avx(auVar116,ZEXT1632(auVar110));
  auVar139._0_4_ = auVar106._0_4_ * auVar116._0_4_;
  auVar139._4_4_ = auVar106._4_4_ * auVar116._4_4_;
  auVar139._8_4_ = auVar106._8_4_ * auVar116._8_4_;
  auVar139._12_4_ = auVar106._12_4_ * auVar116._12_4_;
  auVar139._16_4_ = auVar116._16_4_ * 0.0;
  auVar139._20_4_ = auVar116._20_4_ * 0.0;
  auVar139._24_4_ = auVar116._24_4_ * 0.0;
  auVar139._28_4_ = 0;
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 + uVar96 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,ZEXT1632(auVar233));
  auVar124._4_4_ = auVar116._4_4_ * auVar105._4_4_;
  auVar124._0_4_ = auVar116._0_4_ * auVar105._0_4_;
  auVar124._8_4_ = auVar116._8_4_ * auVar105._8_4_;
  auVar124._12_4_ = auVar116._12_4_ * auVar105._12_4_;
  auVar124._16_4_ = auVar116._16_4_ * 0.0;
  auVar124._20_4_ = auVar116._20_4_ * 0.0;
  auVar124._24_4_ = auVar116._24_4_ * 0.0;
  auVar124._28_4_ = auVar116._28_4_;
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar96 * 0x17 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,ZEXT1632(auVar233));
  auVar122._0_4_ = auVar105._0_4_ * auVar116._0_4_;
  auVar122._4_4_ = auVar105._4_4_ * auVar116._4_4_;
  auVar122._8_4_ = auVar105._8_4_ * auVar116._8_4_;
  auVar122._12_4_ = auVar105._12_4_ * auVar116._12_4_;
  auVar122._16_4_ = auVar116._16_4_ * 0.0;
  auVar122._20_4_ = auVar116._20_4_ * 0.0;
  auVar122._24_4_ = auVar116._24_4_ * 0.0;
  auVar122._28_4_ = 0;
  auVar116 = vpminsd_avx2(auVar117,auVar140);
  auVar114 = vpminsd_avx2(auVar118,auVar139);
  auVar116 = vmaxps_avx(auVar116,auVar114);
  auVar114 = vpminsd_avx2(auVar124,auVar122);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar126._4_4_ = uVar3;
  auVar126._0_4_ = uVar3;
  auVar126._8_4_ = uVar3;
  auVar126._12_4_ = uVar3;
  auVar126._16_4_ = uVar3;
  auVar126._20_4_ = uVar3;
  auVar126._24_4_ = uVar3;
  auVar126._28_4_ = uVar3;
  auVar114 = vmaxps_avx512vl(auVar114,auVar126);
  auVar116 = vmaxps_avx(auVar116,auVar114);
  auVar114._8_4_ = 0x3f7ffffa;
  auVar114._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar114._12_4_ = 0x3f7ffffa;
  auVar114._16_4_ = 0x3f7ffffa;
  auVar114._20_4_ = 0x3f7ffffa;
  auVar114._24_4_ = 0x3f7ffffa;
  auVar114._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar116,auVar114);
  auVar190 = ZEXT3264(local_80);
  auVar116 = vpmaxsd_avx2(auVar117,auVar140);
  auVar114 = vpmaxsd_avx2(auVar118,auVar139);
  auVar116 = vminps_avx(auVar116,auVar114);
  auVar114 = vpmaxsd_avx2(auVar124,auVar122);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar127._4_4_ = uVar3;
  auVar127._0_4_ = uVar3;
  auVar127._8_4_ = uVar3;
  auVar127._12_4_ = uVar3;
  auVar127._16_4_ = uVar3;
  auVar127._20_4_ = uVar3;
  auVar127._24_4_ = uVar3;
  auVar127._28_4_ = uVar3;
  auVar114 = vminps_avx512vl(auVar114,auVar127);
  auVar116 = vminps_avx(auVar116,auVar114);
  auVar125._8_4_ = 0x3f800003;
  auVar125._0_8_ = 0x3f8000033f800003;
  auVar125._12_4_ = 0x3f800003;
  auVar125._16_4_ = 0x3f800003;
  auVar125._20_4_ = 0x3f800003;
  auVar125._24_4_ = 0x3f800003;
  auVar125._28_4_ = 0x3f800003;
  auVar116 = vmulps_avx512vl(auVar116,auVar125);
  uVar22 = vpcmpgtd_avx512vl(auVar115,_DAT_0205a920);
  uVar165 = vcmpps_avx512vl(local_80,auVar116,2);
  if ((byte)((byte)uVar165 & (byte)uVar22) != 0) {
    uVar99 = (ulong)(byte)((byte)uVar165 & (byte)uVar22);
    local_708 = (undefined1 (*) [32])&local_200;
    local_300 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar114 = auVar215._0_32_;
      auVar116 = auVar190._0_32_;
      local_660 = in_ZMM21._0_32_;
      local_640 = in_ZMM20._0_32_;
      lVar23 = 0;
      for (uVar92 = uVar99; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar99 = uVar99 - 1 & uVar99;
      uVar3 = *(undefined4 *)(prim + lVar23 * 4 + 6);
      uVar92 = (ulong)(uint)((int)lVar23 << 6);
      uVar98 = *(uint *)(prim + 2);
      pGVar11 = (context->scene->geometries).items[uVar98].ptr;
      auVar21 = *(undefined1 (*) [16])(prim + uVar92 + lVar75 + 0x16);
      if (uVar99 != 0) {
        uVar95 = uVar99 - 1 & uVar99;
        for (uVar96 = uVar99; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
        }
        if (uVar95 != 0) {
          for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_6b0 = *(undefined1 (*) [16])(prim + uVar92 + lVar75 + 0x26);
      local_6c0 = *(undefined1 (*) [16])(prim + uVar92 + lVar75 + 0x36);
      _local_6d0 = *(undefined1 (*) [16])(prim + uVar92 + lVar75 + 0x46);
      local_5a0 = (uint)pGVar11;
      uStack_59c = (uint)((ulong)pGVar11 >> 0x20);
      iVar9 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar103 = vsubps_avx512vl(auVar21,auVar106);
      uVar164 = auVar103._0_4_;
      auVar107._4_4_ = uVar164;
      auVar107._0_4_ = uVar164;
      auVar107._8_4_ = uVar164;
      auVar107._12_4_ = uVar164;
      auVar105 = vshufps_avx(auVar103,auVar103,0x55);
      auVar103 = vshufps_avx(auVar103,auVar103,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar192 = pre->ray_space[k].vz.field_0.m128[0];
      fVar163 = pre->ray_space[k].vz.field_0.m128[1];
      fVar205 = pre->ray_space[k].vz.field_0.m128[2];
      fVar206 = pre->ray_space[k].vz.field_0.m128[3];
      auVar218._0_4_ = fVar192 * auVar103._0_4_;
      auVar218._4_4_ = fVar163 * auVar103._4_4_;
      auVar218._8_4_ = fVar205 * auVar103._8_4_;
      auVar218._12_4_ = fVar206 * auVar103._12_4_;
      auVar105 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar5,auVar105);
      auVar110 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar4,auVar107);
      auVar104 = vshufps_avx512vl(auVar21,auVar21,0xff);
      auVar103 = vsubps_avx(local_6b0,auVar106);
      uVar164 = auVar103._0_4_;
      auVar186._4_4_ = uVar164;
      auVar186._0_4_ = uVar164;
      auVar186._8_4_ = uVar164;
      auVar186._12_4_ = uVar164;
      auVar105 = vshufps_avx(auVar103,auVar103,0x55);
      auVar103 = vshufps_avx(auVar103,auVar103,0xaa);
      auVar109._0_4_ = fVar192 * auVar103._0_4_;
      auVar109._4_4_ = fVar163 * auVar103._4_4_;
      auVar109._8_4_ = fVar205 * auVar103._8_4_;
      auVar109._12_4_ = fVar206 * auVar103._12_4_;
      auVar105 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar5,auVar105);
      auVar233 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar4,auVar186);
      auVar103 = vsubps_avx512vl(local_6c0,auVar106);
      uVar164 = auVar103._0_4_;
      auVar187._4_4_ = uVar164;
      auVar187._0_4_ = uVar164;
      auVar187._8_4_ = uVar164;
      auVar187._12_4_ = uVar164;
      auVar105 = vshufps_avx(auVar103,auVar103,0x55);
      auVar103 = vshufps_avx(auVar103,auVar103,0xaa);
      auVar221._0_4_ = fVar192 * auVar103._0_4_;
      auVar221._4_4_ = fVar163 * auVar103._4_4_;
      auVar221._8_4_ = fVar205 * auVar103._8_4_;
      auVar221._12_4_ = fVar206 * auVar103._12_4_;
      auVar105 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar5,auVar105);
      auVar103 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar4,auVar187);
      auVar105 = vsubps_avx512vl(_local_6d0,auVar106);
      uVar164 = auVar105._0_4_;
      auVar108._4_4_ = uVar164;
      auVar108._0_4_ = uVar164;
      auVar108._8_4_ = uVar164;
      auVar108._12_4_ = uVar164;
      auVar106 = vshufps_avx(auVar105,auVar105,0x55);
      auVar105 = vshufps_avx(auVar105,auVar105,0xaa);
      auVar222._0_4_ = fVar192 * auVar105._0_4_;
      auVar222._4_4_ = fVar163 * auVar105._4_4_;
      auVar222._8_4_ = fVar205 * auVar105._8_4_;
      auVar222._12_4_ = fVar206 * auVar105._12_4_;
      auVar106 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar5,auVar106);
      auVar6 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar4,auVar108);
      lVar23 = (long)iVar9 * 0x44;
      auVar126 = *(undefined1 (*) [32])(bspline_basis0 + lVar23);
      uVar164 = auVar110._0_4_;
      local_540._4_4_ = uVar164;
      local_540._0_4_ = uVar164;
      local_540._8_4_ = uVar164;
      local_540._12_4_ = uVar164;
      local_540._16_4_ = uVar164;
      local_540._20_4_ = uVar164;
      local_540._24_4_ = uVar164;
      local_540._28_4_ = uVar164;
      auVar179._8_4_ = 1;
      auVar179._0_8_ = 0x100000001;
      auVar179._12_4_ = 1;
      auVar179._16_4_ = 1;
      auVar179._20_4_ = 1;
      auVar179._24_4_ = 1;
      auVar179._28_4_ = 1;
      local_560 = vpermps_avx512vl(auVar179,ZEXT1632(auVar110));
      auVar127 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x484);
      local_700 = vbroadcastss_avx512vl(auVar233);
      local_340 = vpermps_avx2(auVar179,ZEXT1632(auVar233));
      auVar125 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x908);
      local_a0 = vbroadcastss_avx512vl(auVar103);
      local_c0 = vpermps_avx512vl(auVar179,ZEXT1632(auVar103));
      auVar115 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0xd8c);
      local_680 = vbroadcastss_avx512vl(auVar6);
      auVar235 = ZEXT3264(local_680);
      local_6a0 = vpermps_avx512vl(auVar179,ZEXT1632(auVar6));
      auVar236 = ZEXT3264(local_6a0);
      auVar117 = vmulps_avx512vl(local_680,auVar115);
      auVar118 = vmulps_avx512vl(local_6a0,auVar115);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar125,local_a0);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar125,local_c0);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar127,local_700);
      auVar106 = vfmadd231ps_fma(auVar118,auVar127,local_340);
      auVar113 = vfmadd231ps_avx512vl(auVar117,auVar126,local_540);
      auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar106),auVar126,local_560);
      auVar117 = *(undefined1 (*) [32])(bspline_basis1 + lVar23);
      auVar118 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x484);
      auVar124 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x908);
      auVar123 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0xd8c);
      auVar120 = vmulps_avx512vl(local_680,auVar123);
      auVar111 = vmulps_avx512vl(local_6a0,auVar123);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar124,local_a0);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar124,local_c0);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar118,local_700);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar118,local_340);
      auVar7 = vfmadd231ps_fma(auVar120,auVar117,local_540);
      auVar120 = vfmadd231ps_avx512vl(auVar111,auVar117,local_560);
      local_520 = vsubps_avx512vl(ZEXT1632(auVar7),auVar113);
      local_580 = vsubps_avx(auVar120,auVar119);
      auVar111 = vmulps_avx512vl(auVar119,local_520);
      auVar112 = vmulps_avx512vl(auVar113,local_580);
      auVar111 = vsubps_avx512vl(auVar111,auVar112);
      auVar106 = vshufps_avx(local_6b0,local_6b0,0xff);
      uVar165 = auVar104._0_8_;
      local_e0._8_8_ = uVar165;
      local_e0._0_8_ = uVar165;
      local_e0._16_8_ = uVar165;
      local_e0._24_8_ = uVar165;
      local_100 = vbroadcastsd_avx512vl(auVar106);
      auVar106 = vshufps_avx512vl(local_6c0,local_6c0,0xff);
      local_120 = vbroadcastsd_avx512vl(auVar106);
      auVar106 = vshufps_avx512vl(_local_6d0,_local_6d0,0xff);
      uVar165 = auVar106._0_8_;
      register0x00001248 = uVar165;
      local_140 = uVar165;
      register0x00001250 = uVar165;
      register0x00001258 = uVar165;
      auVar112 = vmulps_avx512vl(_local_140,auVar115);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar125,local_120);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar127,local_100);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar126,local_e0);
      auVar121 = vmulps_avx512vl(_local_140,auVar123);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar124,local_120);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar118,local_100);
      auVar104 = vfmadd231ps_fma(auVar121,auVar117,local_e0);
      auVar121 = vmulps_avx512vl(local_580,local_580);
      auVar121 = vfmadd231ps_avx512vl(auVar121,local_520,local_520);
      auVar122 = vmaxps_avx512vl(auVar112,ZEXT1632(auVar104));
      auVar122 = vmulps_avx512vl(auVar122,auVar122);
      auVar121 = vmulps_avx512vl(auVar122,auVar121);
      auVar111 = vmulps_avx512vl(auVar111,auVar111);
      uVar165 = vcmpps_avx512vl(auVar111,auVar121,2);
      auVar106 = vblendps_avx(auVar110,auVar21,8);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar105 = vandps_avx512vl(auVar106,auVar107);
      auVar106 = vblendps_avx(auVar233,local_6b0,8);
      auVar106 = vandps_avx512vl(auVar106,auVar107);
      auVar105 = vmaxps_avx(auVar105,auVar106);
      auVar106 = vblendps_avx(auVar103,local_6c0,8);
      auVar108 = vandps_avx512vl(auVar106,auVar107);
      auVar106 = vblendps_avx(auVar6,_local_6d0,8);
      auVar106 = vandps_avx512vl(auVar106,auVar107);
      auVar106 = vmaxps_avx(auVar108,auVar106);
      auVar106 = vmaxps_avx(auVar105,auVar106);
      auVar105 = vmovshdup_avx(auVar106);
      auVar105 = vmaxss_avx(auVar105,auVar106);
      auVar106 = vshufpd_avx(auVar106,auVar106,1);
      auVar106 = vmaxss_avx(auVar106,auVar105);
      auVar105 = vcvtsi2ss_avx512f(_local_6d0,iVar9);
      local_500._0_16_ = auVar105;
      auVar223._0_4_ = auVar105._0_4_;
      auVar223._4_4_ = auVar223._0_4_;
      auVar223._8_4_ = auVar223._0_4_;
      auVar223._12_4_ = auVar223._0_4_;
      auVar223._16_4_ = auVar223._0_4_;
      auVar223._20_4_ = auVar223._0_4_;
      auVar223._24_4_ = auVar223._0_4_;
      auVar223._28_4_ = auVar223._0_4_;
      uVar22 = vcmpps_avx512vl(auVar223,_DAT_02020f40,0xe);
      bVar100 = (byte)uVar165 & (byte)uVar22;
      auVar106 = vmulss_avx512f(auVar106,ZEXT416(0x35000000));
      auVar188._8_4_ = 2;
      auVar188._0_8_ = 0x200000002;
      auVar188._12_4_ = 2;
      auVar188._16_4_ = 2;
      auVar188._20_4_ = 2;
      auVar188._24_4_ = 2;
      auVar188._28_4_ = 2;
      local_160 = vpermps_avx512vl(auVar188,ZEXT1632(auVar110));
      local_180 = vpermps_avx512vl(auVar188,ZEXT1632(auVar233));
      local_1a0 = vpermps_avx512vl(auVar188,ZEXT1632(auVar103));
      local_1c0 = vpermps_avx2(auVar188,ZEXT1632(auVar6));
      uVar219 = *(uint *)(ray + k * 4 + 0x60);
      auVar105 = local_520._0_16_;
      if (bVar100 == 0) {
        auVar105 = vxorps_avx512vl(auVar105,auVar105);
        auVar234 = ZEXT1664(auVar105);
        auVar215 = ZEXT3264(auVar114);
        in_ZMM20 = ZEXT3264(local_640);
        auVar190 = ZEXT3264(auVar116);
        in_ZMM21 = ZEXT3264(local_660);
        auVar232 = ZEXT3264(local_540);
        auVar230 = ZEXT3264(local_560);
        auVar229 = ZEXT3264(local_700);
      }
      else {
        _local_5c0 = ZEXT416(uVar219);
        auVar123 = vmulps_avx512vl(local_1c0,auVar123);
        auVar124 = vfmadd213ps_avx512vl(auVar124,local_1a0,auVar123);
        auVar118 = vfmadd213ps_avx512vl(auVar118,local_180,auVar124);
        auVar118 = vfmadd213ps_avx512vl(auVar117,local_160,auVar118);
        auVar115 = vmulps_avx512vl(local_1c0,auVar115);
        auVar125 = vfmadd213ps_avx512vl(auVar125,local_1a0,auVar115);
        auVar124 = vfmadd213ps_avx512vl(auVar127,local_180,auVar125);
        auVar127 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1210);
        auVar125 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1694);
        auVar115 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1b18);
        auVar117 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1f9c);
        auVar124 = vfmadd213ps_avx512vl(auVar126,local_160,auVar124);
        auVar126 = vmulps_avx512vl(local_680,auVar117);
        auVar123 = vmulps_avx512vl(local_6a0,auVar117);
        auVar117 = vmulps_avx512vl(local_1c0,auVar117);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar115,local_a0);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar115,local_c0);
        auVar115 = vfmadd231ps_avx512vl(auVar117,local_1a0,auVar115);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar125,local_700);
        auVar103 = vfmadd231ps_fma(auVar123,auVar125,local_340);
        auVar117 = vfmadd231ps_avx512vl(auVar115,local_180,auVar125);
        auVar123 = vfmadd231ps_avx512vl(auVar126,auVar127,local_540);
        auVar230 = ZEXT3264(local_560);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar127,local_560);
        auVar126 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1210);
        auVar125 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1b18);
        auVar115 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1f9c);
        auVar117 = vfmadd231ps_avx512vl(auVar117,local_160,auVar127);
        auVar127 = vmulps_avx512vl(local_680,auVar115);
        auVar121 = vmulps_avx512vl(local_6a0,auVar115);
        auVar115 = vmulps_avx512vl(local_1c0,auVar115);
        auVar122 = vfmadd231ps_avx512vl(auVar127,auVar125,local_a0);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar125,local_c0);
        auVar125 = vfmadd231ps_avx512vl(auVar115,local_1a0,auVar125);
        auVar127 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1694);
        auVar115 = vfmadd231ps_avx512vl(auVar122,auVar127,local_700);
        auVar103 = vfmadd231ps_fma(auVar121,auVar127,local_340);
        auVar127 = vfmadd231ps_avx512vl(auVar125,local_180,auVar127);
        auVar125 = vfmadd231ps_avx512vl(auVar115,auVar126,local_540);
        auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar126,local_560);
        auVar121 = vfmadd231ps_avx512vl(auVar127,local_160,auVar126);
        auVar227._8_4_ = 0x7fffffff;
        auVar227._0_8_ = 0x7fffffff7fffffff;
        auVar227._12_4_ = 0x7fffffff;
        auVar227._16_4_ = 0x7fffffff;
        auVar227._20_4_ = 0x7fffffff;
        auVar227._24_4_ = 0x7fffffff;
        auVar227._28_4_ = 0x7fffffff;
        auVar126 = vandps_avx(auVar123,auVar227);
        auVar127 = vandps_avx(auVar111,auVar227);
        auVar127 = vmaxps_avx(auVar126,auVar127);
        auVar126 = vandps_avx(auVar117,auVar227);
        auVar126 = vmaxps_avx(auVar127,auVar126);
        auVar117 = vbroadcastss_avx512vl(auVar106);
        uVar92 = vcmpps_avx512vl(auVar126,auVar117,1);
        bVar14 = (bool)((byte)uVar92 & 1);
        auVar128._0_4_ = (float)((uint)bVar14 * local_520._0_4_ | (uint)!bVar14 * auVar123._0_4_);
        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar14 * local_520._4_4_ | (uint)!bVar14 * auVar123._4_4_);
        bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar14 * local_520._8_4_ | (uint)!bVar14 * auVar123._8_4_);
        bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar14 * local_520._12_4_ | (uint)!bVar14 * auVar123._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
        auVar128._16_4_ = (float)((uint)bVar14 * local_520._16_4_ | (uint)!bVar14 * auVar123._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar92 >> 5) & 1);
        auVar128._20_4_ = (float)((uint)bVar14 * local_520._20_4_ | (uint)!bVar14 * auVar123._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar92 >> 6) & 1);
        auVar128._24_4_ = (float)((uint)bVar14 * local_520._24_4_ | (uint)!bVar14 * auVar123._24_4_)
        ;
        bVar14 = SUB81(uVar92 >> 7,0);
        auVar128._28_4_ = (uint)bVar14 * local_520._28_4_ | (uint)!bVar14 * auVar123._28_4_;
        bVar14 = (bool)((byte)uVar92 & 1);
        auVar129._0_4_ = (float)((uint)bVar14 * local_580._0_4_ | (uint)!bVar14 * auVar111._0_4_);
        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar14 * local_580._4_4_ | (uint)!bVar14 * auVar111._4_4_);
        bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar14 * local_580._8_4_ | (uint)!bVar14 * auVar111._8_4_);
        bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar14 * local_580._12_4_ | (uint)!bVar14 * auVar111._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
        auVar129._16_4_ = (float)((uint)bVar14 * local_580._16_4_ | (uint)!bVar14 * auVar111._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar92 >> 5) & 1);
        auVar129._20_4_ = (float)((uint)bVar14 * local_580._20_4_ | (uint)!bVar14 * auVar111._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar92 >> 6) & 1);
        auVar129._24_4_ = (float)((uint)bVar14 * local_580._24_4_ | (uint)!bVar14 * auVar111._24_4_)
        ;
        bVar14 = SUB81(uVar92 >> 7,0);
        auVar129._28_4_ = (uint)bVar14 * local_580._28_4_ | (uint)!bVar14 * auVar111._28_4_;
        auVar126 = vandps_avx(auVar227,auVar125);
        auVar127 = vandps_avx(auVar115,auVar227);
        auVar127 = vmaxps_avx(auVar126,auVar127);
        auVar126 = vandps_avx(auVar121,auVar227);
        auVar126 = vmaxps_avx(auVar127,auVar126);
        uVar92 = vcmpps_avx512vl(auVar126,auVar117,1);
        bVar14 = (bool)((byte)uVar92 & 1);
        auVar130._0_4_ = (float)((uint)bVar14 * local_520._0_4_ | (uint)!bVar14 * auVar125._0_4_);
        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar14 * local_520._4_4_ | (uint)!bVar14 * auVar125._4_4_);
        bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar14 * local_520._8_4_ | (uint)!bVar14 * auVar125._8_4_);
        bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar14 * local_520._12_4_ | (uint)!bVar14 * auVar125._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
        auVar130._16_4_ = (float)((uint)bVar14 * local_520._16_4_ | (uint)!bVar14 * auVar125._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar92 >> 5) & 1);
        auVar130._20_4_ = (float)((uint)bVar14 * local_520._20_4_ | (uint)!bVar14 * auVar125._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar92 >> 6) & 1);
        auVar130._24_4_ = (float)((uint)bVar14 * local_520._24_4_ | (uint)!bVar14 * auVar125._24_4_)
        ;
        bVar14 = SUB81(uVar92 >> 7,0);
        auVar130._28_4_ = (uint)bVar14 * local_520._28_4_ | (uint)!bVar14 * auVar125._28_4_;
        bVar14 = (bool)((byte)uVar92 & 1);
        auVar131._0_4_ = (float)((uint)bVar14 * local_580._0_4_ | (uint)!bVar14 * auVar115._0_4_);
        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar131._4_4_ = (float)((uint)bVar14 * local_580._4_4_ | (uint)!bVar14 * auVar115._4_4_);
        bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar131._8_4_ = (float)((uint)bVar14 * local_580._8_4_ | (uint)!bVar14 * auVar115._8_4_);
        bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar131._12_4_ = (float)((uint)bVar14 * local_580._12_4_ | (uint)!bVar14 * auVar115._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
        auVar131._16_4_ = (float)((uint)bVar14 * local_580._16_4_ | (uint)!bVar14 * auVar115._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar92 >> 5) & 1);
        auVar131._20_4_ = (float)((uint)bVar14 * local_580._20_4_ | (uint)!bVar14 * auVar115._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar92 >> 6) & 1);
        auVar131._24_4_ = (float)((uint)bVar14 * local_580._24_4_ | (uint)!bVar14 * auVar115._24_4_)
        ;
        bVar14 = SUB81(uVar92 >> 7,0);
        auVar131._28_4_ = (uint)bVar14 * local_580._28_4_ | (uint)!bVar14 * auVar115._28_4_;
        auVar109 = vxorps_avx512vl(auVar105,auVar105);
        auVar234 = ZEXT1664(auVar109);
        auVar126 = vfmadd213ps_avx512vl(auVar128,auVar128,ZEXT1632(auVar109));
        auVar105 = vfmadd231ps_fma(auVar126,auVar129,auVar129);
        auVar126 = vrsqrt14ps_avx512vl(ZEXT1632(auVar105));
        fVar192 = auVar126._0_4_;
        fVar163 = auVar126._4_4_;
        fVar205 = auVar126._8_4_;
        fVar206 = auVar126._12_4_;
        fVar185 = auVar126._16_4_;
        fVar191 = auVar126._20_4_;
        fVar101 = auVar126._24_4_;
        auVar39._4_4_ = fVar163 * fVar163 * fVar163 * auVar105._4_4_ * -0.5;
        auVar39._0_4_ = fVar192 * fVar192 * fVar192 * auVar105._0_4_ * -0.5;
        auVar39._8_4_ = fVar205 * fVar205 * fVar205 * auVar105._8_4_ * -0.5;
        auVar39._12_4_ = fVar206 * fVar206 * fVar206 * auVar105._12_4_ * -0.5;
        auVar39._16_4_ = fVar185 * fVar185 * fVar185 * -0.0;
        auVar39._20_4_ = fVar191 * fVar191 * fVar191 * -0.0;
        auVar39._24_4_ = fVar101 * fVar101 * fVar101 * -0.0;
        auVar39._28_4_ = 0;
        auVar127 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar125 = vfmadd231ps_avx512vl(auVar39,auVar127,auVar126);
        auVar40._4_4_ = auVar129._4_4_ * auVar125._4_4_;
        auVar40._0_4_ = auVar129._0_4_ * auVar125._0_4_;
        auVar40._8_4_ = auVar129._8_4_ * auVar125._8_4_;
        auVar40._12_4_ = auVar129._12_4_ * auVar125._12_4_;
        auVar40._16_4_ = auVar129._16_4_ * auVar125._16_4_;
        auVar40._20_4_ = auVar129._20_4_ * auVar125._20_4_;
        auVar40._24_4_ = auVar129._24_4_ * auVar125._24_4_;
        auVar40._28_4_ = auVar126._28_4_;
        auVar41._4_4_ = auVar125._4_4_ * -auVar128._4_4_;
        auVar41._0_4_ = auVar125._0_4_ * -auVar128._0_4_;
        auVar41._8_4_ = auVar125._8_4_ * -auVar128._8_4_;
        auVar41._12_4_ = auVar125._12_4_ * -auVar128._12_4_;
        auVar41._16_4_ = auVar125._16_4_ * -auVar128._16_4_;
        auVar41._20_4_ = auVar125._20_4_ * -auVar128._20_4_;
        auVar41._24_4_ = auVar125._24_4_ * -auVar128._24_4_;
        auVar41._28_4_ = auVar128._28_4_ ^ 0x80000000;
        auVar126 = vmulps_avx512vl(auVar125,ZEXT1632(auVar109));
        auVar111 = ZEXT1632(auVar109);
        auVar115 = vfmadd213ps_avx512vl(auVar130,auVar130,auVar111);
        auVar105 = vfmadd231ps_fma(auVar115,auVar131,auVar131);
        auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar105));
        fVar192 = auVar115._0_4_;
        fVar163 = auVar115._4_4_;
        fVar205 = auVar115._8_4_;
        fVar206 = auVar115._12_4_;
        fVar185 = auVar115._16_4_;
        fVar191 = auVar115._20_4_;
        fVar101 = auVar115._24_4_;
        auVar42._4_4_ = fVar163 * fVar163 * fVar163 * auVar105._4_4_ * -0.5;
        auVar42._0_4_ = fVar192 * fVar192 * fVar192 * auVar105._0_4_ * -0.5;
        auVar42._8_4_ = fVar205 * fVar205 * fVar205 * auVar105._8_4_ * -0.5;
        auVar42._12_4_ = fVar206 * fVar206 * fVar206 * auVar105._12_4_ * -0.5;
        auVar42._16_4_ = fVar185 * fVar185 * fVar185 * -0.0;
        auVar42._20_4_ = fVar191 * fVar191 * fVar191 * -0.0;
        auVar42._24_4_ = fVar101 * fVar101 * fVar101 * -0.0;
        auVar42._28_4_ = 0;
        auVar127 = vfmadd231ps_avx512vl(auVar42,auVar127,auVar115);
        auVar43._4_4_ = auVar131._4_4_ * auVar127._4_4_;
        auVar43._0_4_ = auVar131._0_4_ * auVar127._0_4_;
        auVar43._8_4_ = auVar131._8_4_ * auVar127._8_4_;
        auVar43._12_4_ = auVar131._12_4_ * auVar127._12_4_;
        auVar43._16_4_ = auVar131._16_4_ * auVar127._16_4_;
        auVar43._20_4_ = auVar131._20_4_ * auVar127._20_4_;
        auVar43._24_4_ = auVar131._24_4_ * auVar127._24_4_;
        auVar43._28_4_ = auVar115._28_4_;
        auVar44._4_4_ = -auVar130._4_4_ * auVar127._4_4_;
        auVar44._0_4_ = -auVar130._0_4_ * auVar127._0_4_;
        auVar44._8_4_ = -auVar130._8_4_ * auVar127._8_4_;
        auVar44._12_4_ = -auVar130._12_4_ * auVar127._12_4_;
        auVar44._16_4_ = -auVar130._16_4_ * auVar127._16_4_;
        auVar44._20_4_ = -auVar130._20_4_ * auVar127._20_4_;
        auVar44._24_4_ = -auVar130._24_4_ * auVar127._24_4_;
        auVar44._28_4_ = auVar125._28_4_;
        auVar127 = vmulps_avx512vl(auVar127,auVar111);
        auVar105 = vfmadd213ps_fma(auVar40,auVar112,auVar113);
        auVar103 = vfmadd213ps_fma(auVar41,auVar112,auVar119);
        auVar125 = vfmadd213ps_avx512vl(auVar126,auVar112,auVar124);
        auVar115 = vfmadd213ps_avx512vl(auVar43,ZEXT1632(auVar104),ZEXT1632(auVar7));
        auVar107 = vfnmadd213ps_fma(auVar40,auVar112,auVar113);
        auVar123 = ZEXT1632(auVar104);
        auVar110 = vfmadd213ps_fma(auVar44,auVar123,auVar120);
        auVar108 = vfnmadd213ps_fma(auVar41,auVar112,auVar119);
        auVar233 = vfmadd213ps_fma(auVar127,auVar123,auVar118);
        auVar117 = vfnmadd231ps_avx512vl(auVar124,auVar112,auVar126);
        auVar186 = vfnmadd213ps_fma(auVar43,auVar123,ZEXT1632(auVar7));
        auVar187 = vfnmadd213ps_fma(auVar44,auVar123,auVar120);
        auVar218 = vfnmadd231ps_fma(auVar118,ZEXT1632(auVar104),auVar127);
        auVar127 = vsubps_avx512vl(auVar115,ZEXT1632(auVar107));
        auVar126 = vsubps_avx(ZEXT1632(auVar110),ZEXT1632(auVar108));
        auVar118 = vsubps_avx512vl(ZEXT1632(auVar233),auVar117);
        auVar124 = vmulps_avx512vl(auVar126,auVar117);
        auVar6 = vfmsub231ps_fma(auVar124,ZEXT1632(auVar108),auVar118);
        auVar45._4_4_ = auVar107._4_4_ * auVar118._4_4_;
        auVar45._0_4_ = auVar107._0_4_ * auVar118._0_4_;
        auVar45._8_4_ = auVar107._8_4_ * auVar118._8_4_;
        auVar45._12_4_ = auVar107._12_4_ * auVar118._12_4_;
        auVar45._16_4_ = auVar118._16_4_ * 0.0;
        auVar45._20_4_ = auVar118._20_4_ * 0.0;
        auVar45._24_4_ = auVar118._24_4_ * 0.0;
        auVar45._28_4_ = auVar118._28_4_;
        auVar118 = vfmsub231ps_avx512vl(auVar45,auVar117,auVar127);
        auVar46._4_4_ = auVar108._4_4_ * auVar127._4_4_;
        auVar46._0_4_ = auVar108._0_4_ * auVar127._0_4_;
        auVar46._8_4_ = auVar108._8_4_ * auVar127._8_4_;
        auVar46._12_4_ = auVar108._12_4_ * auVar127._12_4_;
        auVar46._16_4_ = auVar127._16_4_ * 0.0;
        auVar46._20_4_ = auVar127._20_4_ * 0.0;
        auVar46._24_4_ = auVar127._24_4_ * 0.0;
        auVar46._28_4_ = auVar127._28_4_;
        auVar7 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar107),auVar126);
        auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar111,auVar118);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar111,ZEXT1632(auVar6));
        auVar111 = ZEXT1632(auVar109);
        uVar92 = vcmpps_avx512vl(auVar126,auVar111,2);
        bVar91 = (byte)uVar92;
        fVar101 = (float)((uint)(bVar91 & 1) * auVar105._0_4_ |
                         (uint)!(bool)(bVar91 & 1) * auVar186._0_4_);
        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
        fVar184 = (float)((uint)bVar14 * auVar105._4_4_ | (uint)!bVar14 * auVar186._4_4_);
        bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
        fVar156 = (float)((uint)bVar14 * auVar105._8_4_ | (uint)!bVar14 * auVar186._8_4_);
        bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
        fVar159 = (float)((uint)bVar14 * auVar105._12_4_ | (uint)!bVar14 * auVar186._12_4_);
        auVar124 = ZEXT1632(CONCAT412(fVar159,CONCAT48(fVar156,CONCAT44(fVar184,fVar101))));
        fVar102 = (float)((uint)(bVar91 & 1) * auVar103._0_4_ |
                         (uint)!(bool)(bVar91 & 1) * auVar187._0_4_);
        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
        fVar155 = (float)((uint)bVar14 * auVar103._4_4_ | (uint)!bVar14 * auVar187._4_4_);
        bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
        fVar157 = (float)((uint)bVar14 * auVar103._8_4_ | (uint)!bVar14 * auVar187._8_4_);
        bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
        fVar160 = (float)((uint)bVar14 * auVar103._12_4_ | (uint)!bVar14 * auVar187._12_4_);
        auVar123 = ZEXT1632(CONCAT412(fVar160,CONCAT48(fVar157,CONCAT44(fVar155,fVar102))));
        auVar132._0_4_ =
             (float)((uint)(bVar91 & 1) * auVar125._0_4_ |
                    (uint)!(bool)(bVar91 & 1) * auVar218._0_4_);
        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar132._4_4_ = (float)((uint)bVar14 * auVar125._4_4_ | (uint)!bVar14 * auVar218._4_4_);
        bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar132._8_4_ = (float)((uint)bVar14 * auVar125._8_4_ | (uint)!bVar14 * auVar218._8_4_);
        bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar132._12_4_ = (float)((uint)bVar14 * auVar125._12_4_ | (uint)!bVar14 * auVar218._12_4_);
        fVar192 = (float)((uint)((byte)(uVar92 >> 4) & 1) * auVar125._16_4_);
        auVar132._16_4_ = fVar192;
        fVar163 = (float)((uint)((byte)(uVar92 >> 5) & 1) * auVar125._20_4_);
        auVar132._20_4_ = fVar163;
        fVar205 = (float)((uint)((byte)(uVar92 >> 6) & 1) * auVar125._24_4_);
        auVar132._24_4_ = fVar205;
        iVar1 = (uint)(byte)(uVar92 >> 7) * auVar125._28_4_;
        auVar132._28_4_ = iVar1;
        auVar127 = vblendmps_avx512vl(ZEXT1632(auVar107),auVar115);
        auVar133._0_4_ =
             (uint)(bVar91 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar6._0_4_;
        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar14 * auVar127._4_4_ | (uint)!bVar14 * auVar6._4_4_;
        bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar14 * auVar127._8_4_ | (uint)!bVar14 * auVar6._8_4_;
        bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar14 * auVar127._12_4_ | (uint)!bVar14 * auVar6._12_4_;
        auVar133._16_4_ = (uint)((byte)(uVar92 >> 4) & 1) * auVar127._16_4_;
        auVar133._20_4_ = (uint)((byte)(uVar92 >> 5) & 1) * auVar127._20_4_;
        auVar133._24_4_ = (uint)((byte)(uVar92 >> 6) & 1) * auVar127._24_4_;
        auVar133._28_4_ = (uint)(byte)(uVar92 >> 7) * auVar127._28_4_;
        auVar127 = vblendmps_avx512vl(ZEXT1632(auVar108),ZEXT1632(auVar110));
        auVar134._0_4_ =
             (float)((uint)(bVar91 & 1) * auVar127._0_4_ |
                    (uint)!(bool)(bVar91 & 1) * auVar103._0_4_);
        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar134._4_4_ = (float)((uint)bVar14 * auVar127._4_4_ | (uint)!bVar14 * auVar103._4_4_);
        bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar134._8_4_ = (float)((uint)bVar14 * auVar127._8_4_ | (uint)!bVar14 * auVar103._8_4_);
        bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar134._12_4_ = (float)((uint)bVar14 * auVar127._12_4_ | (uint)!bVar14 * auVar103._12_4_);
        fVar206 = (float)((uint)((byte)(uVar92 >> 4) & 1) * auVar127._16_4_);
        auVar134._16_4_ = fVar206;
        fVar185 = (float)((uint)((byte)(uVar92 >> 5) & 1) * auVar127._20_4_);
        auVar134._20_4_ = fVar185;
        fVar191 = (float)((uint)((byte)(uVar92 >> 6) & 1) * auVar127._24_4_);
        auVar134._24_4_ = fVar191;
        auVar134._28_4_ = (uint)(byte)(uVar92 >> 7) * auVar127._28_4_;
        auVar127 = vblendmps_avx512vl(auVar117,ZEXT1632(auVar233));
        auVar135._0_4_ =
             (float)((uint)(bVar91 & 1) * auVar127._0_4_ |
                    (uint)!(bool)(bVar91 & 1) * auVar125._0_4_);
        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar135._4_4_ = (float)((uint)bVar14 * auVar127._4_4_ | (uint)!bVar14 * auVar125._4_4_);
        bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar135._8_4_ = (float)((uint)bVar14 * auVar127._8_4_ | (uint)!bVar14 * auVar125._8_4_);
        bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar135._12_4_ = (float)((uint)bVar14 * auVar127._12_4_ | (uint)!bVar14 * auVar125._12_4_);
        bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
        auVar135._16_4_ = (float)((uint)bVar14 * auVar127._16_4_ | (uint)!bVar14 * auVar125._16_4_);
        bVar14 = (bool)((byte)(uVar92 >> 5) & 1);
        auVar135._20_4_ = (float)((uint)bVar14 * auVar127._20_4_ | (uint)!bVar14 * auVar125._20_4_);
        bVar14 = (bool)((byte)(uVar92 >> 6) & 1);
        auVar135._24_4_ = (float)((uint)bVar14 * auVar127._24_4_ | (uint)!bVar14 * auVar125._24_4_);
        bVar14 = SUB81(uVar92 >> 7,0);
        auVar135._28_4_ = (uint)bVar14 * auVar127._28_4_ | (uint)!bVar14 * auVar125._28_4_;
        auVar136._0_4_ =
             (uint)(bVar91 & 1) * (int)auVar107._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar115._0_4_;
        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar14 * (int)auVar107._4_4_ | (uint)!bVar14 * auVar115._4_4_;
        bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar14 * (int)auVar107._8_4_ | (uint)!bVar14 * auVar115._8_4_;
        bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar14 * (int)auVar107._12_4_ | (uint)!bVar14 * auVar115._12_4_;
        auVar136._16_4_ = (uint)!(bool)((byte)(uVar92 >> 4) & 1) * auVar115._16_4_;
        auVar136._20_4_ = (uint)!(bool)((byte)(uVar92 >> 5) & 1) * auVar115._20_4_;
        auVar136._24_4_ = (uint)!(bool)((byte)(uVar92 >> 6) & 1) * auVar115._24_4_;
        auVar136._28_4_ = (uint)!SUB81(uVar92 >> 7,0) * auVar115._28_4_;
        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar92 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar137._0_4_ =
             (uint)(bVar91 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar233._0_4_;
        bVar15 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar137._4_4_ = (uint)bVar15 * auVar117._4_4_ | (uint)!bVar15 * auVar233._4_4_;
        bVar15 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar137._8_4_ = (uint)bVar15 * auVar117._8_4_ | (uint)!bVar15 * auVar233._8_4_;
        bVar15 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar137._12_4_ = (uint)bVar15 * auVar117._12_4_ | (uint)!bVar15 * auVar233._12_4_;
        auVar137._16_4_ = (uint)((byte)(uVar92 >> 4) & 1) * auVar117._16_4_;
        auVar137._20_4_ = (uint)((byte)(uVar92 >> 5) & 1) * auVar117._20_4_;
        auVar137._24_4_ = (uint)((byte)(uVar92 >> 6) & 1) * auVar117._24_4_;
        iVar2 = (uint)(byte)(uVar92 >> 7) * auVar117._28_4_;
        auVar137._28_4_ = iVar2;
        auVar113 = vsubps_avx512vl(auVar136,auVar124);
        auVar127 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar108._12_4_ |
                                                 (uint)!bVar17 * auVar110._12_4_,
                                                 CONCAT48((uint)bVar16 * (int)auVar108._8_4_ |
                                                          (uint)!bVar16 * auVar110._8_4_,
                                                          CONCAT44((uint)bVar14 *
                                                                   (int)auVar108._4_4_ |
                                                                   (uint)!bVar14 * auVar110._4_4_,
                                                                   (uint)(bVar91 & 1) *
                                                                   (int)auVar108._0_4_ |
                                                                   (uint)!(bool)(bVar91 & 1) *
                                                                   auVar110._0_4_)))),auVar123);
        auVar125 = vsubps_avx(auVar137,auVar132);
        auVar115 = vsubps_avx(auVar124,auVar133);
        auVar117 = vsubps_avx(auVar123,auVar134);
        auVar118 = vsubps_avx(auVar132,auVar135);
        auVar47._4_4_ = auVar125._4_4_ * fVar184;
        auVar47._0_4_ = auVar125._0_4_ * fVar101;
        auVar47._8_4_ = auVar125._8_4_ * fVar156;
        auVar47._12_4_ = auVar125._12_4_ * fVar159;
        auVar47._16_4_ = auVar125._16_4_ * 0.0;
        auVar47._20_4_ = auVar125._20_4_ * 0.0;
        auVar47._24_4_ = auVar125._24_4_ * 0.0;
        auVar47._28_4_ = iVar2;
        auVar105 = vfmsub231ps_fma(auVar47,auVar132,auVar113);
        auVar48._4_4_ = fVar155 * auVar113._4_4_;
        auVar48._0_4_ = fVar102 * auVar113._0_4_;
        auVar48._8_4_ = fVar157 * auVar113._8_4_;
        auVar48._12_4_ = fVar160 * auVar113._12_4_;
        auVar48._16_4_ = auVar113._16_4_ * 0.0;
        auVar48._20_4_ = auVar113._20_4_ * 0.0;
        auVar48._24_4_ = auVar113._24_4_ * 0.0;
        auVar48._28_4_ = auVar126._28_4_;
        auVar103 = vfmsub231ps_fma(auVar48,auVar124,auVar127);
        auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar111,ZEXT1632(auVar105));
        auVar199._0_4_ = auVar127._0_4_ * auVar132._0_4_;
        auVar199._4_4_ = auVar127._4_4_ * auVar132._4_4_;
        auVar199._8_4_ = auVar127._8_4_ * auVar132._8_4_;
        auVar199._12_4_ = auVar127._12_4_ * auVar132._12_4_;
        auVar199._16_4_ = auVar127._16_4_ * fVar192;
        auVar199._20_4_ = auVar127._20_4_ * fVar163;
        auVar199._24_4_ = auVar127._24_4_ * fVar205;
        auVar199._28_4_ = 0;
        auVar105 = vfmsub231ps_fma(auVar199,auVar123,auVar125);
        auVar119 = vfmadd231ps_avx512vl(auVar126,auVar111,ZEXT1632(auVar105));
        auVar126 = vmulps_avx512vl(auVar118,auVar133);
        auVar126 = vfmsub231ps_avx512vl(auVar126,auVar115,auVar135);
        auVar49._4_4_ = auVar117._4_4_ * auVar135._4_4_;
        auVar49._0_4_ = auVar117._0_4_ * auVar135._0_4_;
        auVar49._8_4_ = auVar117._8_4_ * auVar135._8_4_;
        auVar49._12_4_ = auVar117._12_4_ * auVar135._12_4_;
        auVar49._16_4_ = auVar117._16_4_ * auVar135._16_4_;
        auVar49._20_4_ = auVar117._20_4_ * auVar135._20_4_;
        auVar49._24_4_ = auVar117._24_4_ * auVar135._24_4_;
        auVar49._28_4_ = auVar135._28_4_;
        auVar105 = vfmsub231ps_fma(auVar49,auVar134,auVar118);
        auVar200._0_4_ = auVar134._0_4_ * auVar115._0_4_;
        auVar200._4_4_ = auVar134._4_4_ * auVar115._4_4_;
        auVar200._8_4_ = auVar134._8_4_ * auVar115._8_4_;
        auVar200._12_4_ = auVar134._12_4_ * auVar115._12_4_;
        auVar200._16_4_ = fVar206 * auVar115._16_4_;
        auVar200._20_4_ = fVar185 * auVar115._20_4_;
        auVar200._24_4_ = fVar191 * auVar115._24_4_;
        auVar200._28_4_ = 0;
        auVar103 = vfmsub231ps_fma(auVar200,auVar117,auVar133);
        auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar111,auVar126);
        auVar120 = vfmadd231ps_avx512vl(auVar126,auVar111,ZEXT1632(auVar105));
        auVar126 = vmaxps_avx(auVar119,auVar120);
        uVar165 = vcmpps_avx512vl(auVar126,auVar111,2);
        bVar100 = bVar100 & (byte)uVar165;
        in_ZMM20 = ZEXT3264(local_640);
        in_ZMM21 = ZEXT3264(local_660);
        auVar232 = ZEXT3264(local_540);
        auVar229 = ZEXT3264(local_700);
        if (bVar100 == 0) {
          bVar100 = 0;
          auVar215 = ZEXT3264(auVar114);
          auVar190 = ZEXT3264(auVar116);
        }
        else {
          auVar50._4_4_ = auVar118._4_4_ * auVar127._4_4_;
          auVar50._0_4_ = auVar118._0_4_ * auVar127._0_4_;
          auVar50._8_4_ = auVar118._8_4_ * auVar127._8_4_;
          auVar50._12_4_ = auVar118._12_4_ * auVar127._12_4_;
          auVar50._16_4_ = auVar118._16_4_ * auVar127._16_4_;
          auVar50._20_4_ = auVar118._20_4_ * auVar127._20_4_;
          auVar50._24_4_ = auVar118._24_4_ * auVar127._24_4_;
          auVar50._28_4_ = auVar126._28_4_;
          auVar110 = vfmsub231ps_fma(auVar50,auVar117,auVar125);
          auVar51._4_4_ = auVar125._4_4_ * auVar115._4_4_;
          auVar51._0_4_ = auVar125._0_4_ * auVar115._0_4_;
          auVar51._8_4_ = auVar125._8_4_ * auVar115._8_4_;
          auVar51._12_4_ = auVar125._12_4_ * auVar115._12_4_;
          auVar51._16_4_ = auVar125._16_4_ * auVar115._16_4_;
          auVar51._20_4_ = auVar125._20_4_ * auVar115._20_4_;
          auVar51._24_4_ = auVar125._24_4_ * auVar115._24_4_;
          auVar51._28_4_ = auVar125._28_4_;
          auVar103 = vfmsub231ps_fma(auVar51,auVar113,auVar118);
          auVar52._4_4_ = auVar117._4_4_ * auVar113._4_4_;
          auVar52._0_4_ = auVar117._0_4_ * auVar113._0_4_;
          auVar52._8_4_ = auVar117._8_4_ * auVar113._8_4_;
          auVar52._12_4_ = auVar117._12_4_ * auVar113._12_4_;
          auVar52._16_4_ = auVar117._16_4_ * auVar113._16_4_;
          auVar52._20_4_ = auVar117._20_4_ * auVar113._20_4_;
          auVar52._24_4_ = auVar117._24_4_ * auVar113._24_4_;
          auVar52._28_4_ = auVar117._28_4_;
          auVar233 = vfmsub231ps_fma(auVar52,auVar115,auVar127);
          auVar105 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar103),ZEXT1632(auVar233));
          auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar105),ZEXT1632(auVar110),auVar111);
          auVar127 = vrcp14ps_avx512vl(auVar126);
          auVar28._8_4_ = 0x3f800000;
          auVar28._0_8_ = &DAT_3f8000003f800000;
          auVar28._12_4_ = 0x3f800000;
          auVar28._16_4_ = 0x3f800000;
          auVar28._20_4_ = 0x3f800000;
          auVar28._24_4_ = 0x3f800000;
          auVar28._28_4_ = 0x3f800000;
          auVar125 = vfnmadd213ps_avx512vl(auVar127,auVar126,auVar28);
          auVar105 = vfmadd132ps_fma(auVar125,auVar127,auVar127);
          auVar53._4_4_ = auVar233._4_4_ * auVar132._4_4_;
          auVar53._0_4_ = auVar233._0_4_ * auVar132._0_4_;
          auVar53._8_4_ = auVar233._8_4_ * auVar132._8_4_;
          auVar53._12_4_ = auVar233._12_4_ * auVar132._12_4_;
          auVar53._16_4_ = fVar192 * 0.0;
          auVar53._20_4_ = fVar163 * 0.0;
          auVar53._24_4_ = fVar205 * 0.0;
          auVar53._28_4_ = iVar1;
          auVar103 = vfmadd231ps_fma(auVar53,auVar123,ZEXT1632(auVar103));
          auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar124,ZEXT1632(auVar110));
          fVar192 = auVar105._0_4_;
          fVar163 = auVar105._4_4_;
          fVar205 = auVar105._8_4_;
          fVar206 = auVar105._12_4_;
          auVar127 = ZEXT1632(CONCAT412(auVar103._12_4_ * fVar206,
                                        CONCAT48(auVar103._8_4_ * fVar205,
                                                 CONCAT44(auVar103._4_4_ * fVar163,
                                                          auVar103._0_4_ * fVar192))));
          auVar217._4_4_ = uVar219;
          auVar217._0_4_ = uVar219;
          auVar217._8_4_ = uVar219;
          auVar217._12_4_ = uVar219;
          auVar217._16_4_ = uVar219;
          auVar217._20_4_ = uVar219;
          auVar217._24_4_ = uVar219;
          auVar217._28_4_ = uVar219;
          uVar165 = vcmpps_avx512vl(auVar217,auVar127,2);
          uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar29._4_4_ = uVar164;
          auVar29._0_4_ = uVar164;
          auVar29._8_4_ = uVar164;
          auVar29._12_4_ = uVar164;
          auVar29._16_4_ = uVar164;
          auVar29._20_4_ = uVar164;
          auVar29._24_4_ = uVar164;
          auVar29._28_4_ = uVar164;
          uVar22 = vcmpps_avx512vl(auVar127,auVar29,2);
          bVar100 = (byte)uVar165 & (byte)uVar22 & bVar100;
          if (bVar100 == 0) {
            bVar100 = 0;
            auVar215 = ZEXT3264(auVar114);
            auVar190 = ZEXT3264(auVar116);
          }
          else {
            uVar165 = vcmpps_avx512vl(auVar126,auVar111,4);
            if ((bVar100 & (byte)uVar165) == 0) {
              bVar100 = 0;
              auVar215 = ZEXT3264(auVar114);
              auVar190 = ZEXT3264(auVar116);
            }
            else {
              bVar100 = bVar100 & (byte)uVar165;
              fVar185 = auVar119._0_4_ * fVar192;
              fVar191 = auVar119._4_4_ * fVar163;
              auVar54._4_4_ = fVar191;
              auVar54._0_4_ = fVar185;
              fVar101 = auVar119._8_4_ * fVar205;
              auVar54._8_4_ = fVar101;
              fVar102 = auVar119._12_4_ * fVar206;
              auVar54._12_4_ = fVar102;
              fVar184 = auVar119._16_4_ * 0.0;
              auVar54._16_4_ = fVar184;
              fVar155 = auVar119._20_4_ * 0.0;
              auVar54._20_4_ = fVar155;
              fVar156 = auVar119._24_4_ * 0.0;
              auVar54._24_4_ = fVar156;
              auVar54._28_4_ = auVar119._28_4_;
              fVar192 = auVar120._0_4_ * fVar192;
              fVar163 = auVar120._4_4_ * fVar163;
              auVar55._4_4_ = fVar163;
              auVar55._0_4_ = fVar192;
              fVar205 = auVar120._8_4_ * fVar205;
              auVar55._8_4_ = fVar205;
              fVar206 = auVar120._12_4_ * fVar206;
              auVar55._12_4_ = fVar206;
              fVar157 = auVar120._16_4_ * 0.0;
              auVar55._16_4_ = fVar157;
              fVar159 = auVar120._20_4_ * 0.0;
              auVar55._20_4_ = fVar159;
              fVar160 = auVar120._24_4_ * 0.0;
              auVar55._24_4_ = fVar160;
              auVar55._28_4_ = auVar120._28_4_;
              auVar209._8_4_ = 0x3f800000;
              auVar209._0_8_ = &DAT_3f8000003f800000;
              auVar209._12_4_ = 0x3f800000;
              auVar209._16_4_ = 0x3f800000;
              auVar209._20_4_ = 0x3f800000;
              auVar209._24_4_ = 0x3f800000;
              auVar209._28_4_ = 0x3f800000;
              auVar116 = vsubps_avx(auVar209,auVar54);
              bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar92 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar92 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
              bVar20 = SUB81(uVar92 >> 7,0);
              auVar215 = ZEXT3264(CONCAT428((uint)bVar20 * auVar119._28_4_ |
                                            (uint)!bVar20 * auVar116._28_4_,
                                            CONCAT424((uint)bVar19 * (int)fVar156 |
                                                      (uint)!bVar19 * auVar116._24_4_,
                                                      CONCAT420((uint)bVar18 * (int)fVar155 |
                                                                (uint)!bVar18 * auVar116._20_4_,
                                                                CONCAT416((uint)bVar17 *
                                                                          (int)fVar184 |
                                                                          (uint)!bVar17 *
                                                                          auVar116._16_4_,
                                                                          CONCAT412((uint)bVar16 *
                                                                                    (int)fVar102 |
                                                                                    (uint)!bVar16 *
                                                                                    auVar116._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar15 * (int)fVar101 |
                                                  (uint)!bVar15 * auVar116._8_4_,
                                                  CONCAT44((uint)bVar14 * (int)fVar191 |
                                                           (uint)!bVar14 * auVar116._4_4_,
                                                           (uint)(bVar91 & 1) * (int)fVar185 |
                                                           (uint)!(bool)(bVar91 & 1) *
                                                           auVar116._0_4_))))))));
              auVar116 = vsubps_avx(auVar209,auVar55);
              bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar92 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar92 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
              bVar20 = SUB81(uVar92 >> 7,0);
              local_360._4_4_ = (uint)bVar14 * (int)fVar163 | (uint)!bVar14 * auVar116._4_4_;
              local_360._0_4_ =
                   (uint)(bVar91 & 1) * (int)fVar192 | (uint)!(bool)(bVar91 & 1) * auVar116._0_4_;
              local_360._8_4_ = (uint)bVar15 * (int)fVar205 | (uint)!bVar15 * auVar116._8_4_;
              local_360._12_4_ = (uint)bVar16 * (int)fVar206 | (uint)!bVar16 * auVar116._12_4_;
              local_360._16_4_ = (uint)bVar17 * (int)fVar157 | (uint)!bVar17 * auVar116._16_4_;
              local_360._20_4_ = (uint)bVar18 * (int)fVar159 | (uint)!bVar18 * auVar116._20_4_;
              local_360._24_4_ = (uint)bVar19 * (int)fVar160 | (uint)!bVar19 * auVar116._24_4_;
              local_360._28_4_ = (uint)bVar20 * auVar120._28_4_ | (uint)!bVar20 * auVar116._28_4_;
              auVar190 = ZEXT3264(auVar127);
            }
          }
        }
        auVar236 = ZEXT3264(local_6a0);
        auVar235 = ZEXT3264(local_680);
        if (bVar100 != 0) {
          auVar116 = vsubps_avx(ZEXT1632(auVar104),auVar112);
          auVar126 = auVar215._0_32_;
          auVar105 = vfmadd213ps_fma(auVar116,auVar126,auVar112);
          uVar164 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar30._4_4_ = uVar164;
          auVar30._0_4_ = uVar164;
          auVar30._8_4_ = uVar164;
          auVar30._12_4_ = uVar164;
          auVar30._16_4_ = uVar164;
          auVar30._20_4_ = uVar164;
          auVar30._24_4_ = uVar164;
          auVar30._28_4_ = uVar164;
          auVar116 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar105._12_4_ + auVar105._12_4_,
                                                        CONCAT48(auVar105._8_4_ + auVar105._8_4_,
                                                                 CONCAT44(auVar105._4_4_ +
                                                                          auVar105._4_4_,
                                                                          auVar105._0_4_ +
                                                                          auVar105._0_4_)))),auVar30
                                    );
          auVar114 = auVar190._0_32_;
          uVar165 = vcmpps_avx512vl(auVar114,auVar116,6);
          bVar100 = bVar100 & (byte)uVar165;
          if (bVar100 != 0) {
            auVar170._8_4_ = 0xbf800000;
            auVar170._0_8_ = 0xbf800000bf800000;
            auVar170._12_4_ = 0xbf800000;
            auVar170._16_4_ = 0xbf800000;
            auVar170._20_4_ = 0xbf800000;
            auVar170._24_4_ = 0xbf800000;
            auVar170._28_4_ = 0xbf800000;
            auVar31._8_4_ = 0x40000000;
            auVar31._0_8_ = 0x4000000040000000;
            auVar31._12_4_ = 0x40000000;
            auVar31._16_4_ = 0x40000000;
            auVar31._20_4_ = 0x40000000;
            auVar31._24_4_ = 0x40000000;
            auVar31._28_4_ = 0x40000000;
            local_4c0 = vfmadd132ps_avx512vl(local_360,auVar170,auVar31);
            local_360 = local_4c0;
            auVar116 = local_360;
            local_480 = 0;
            local_460 = local_6b0._0_8_;
            uStack_458 = local_6b0._8_8_;
            local_450 = local_6c0._0_8_;
            uStack_448 = local_6c0._8_8_;
            local_440 = local_6d0;
            uStack_438 = uStack_6c8;
            local_360 = auVar116;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar192 = 1.0 / auVar223._0_4_;
              local_420[0] = fVar192 * (auVar215._0_4_ + 0.0);
              local_420[1] = fVar192 * (auVar215._4_4_ + 1.0);
              local_420[2] = fVar192 * (auVar215._8_4_ + 2.0);
              local_420[3] = fVar192 * (auVar215._12_4_ + 3.0);
              fStack_410 = fVar192 * (auVar215._16_4_ + 4.0);
              fStack_40c = fVar192 * (auVar215._20_4_ + 5.0);
              fStack_408 = fVar192 * (auVar215._24_4_ + 6.0);
              fStack_404 = auVar215._28_4_ + 7.0;
              local_360._0_8_ = local_4c0._0_8_;
              local_360._8_8_ = local_4c0._8_8_;
              local_360._16_8_ = local_4c0._16_8_;
              local_360._24_8_ = local_4c0._24_8_;
              local_400 = local_360._0_8_;
              uStack_3f8 = local_360._8_8_;
              uStack_3f0 = local_360._16_8_;
              uStack_3e8 = local_360._24_8_;
              local_3e0 = auVar114;
              auVar171._8_4_ = 0x7f800000;
              auVar171._0_8_ = 0x7f8000007f800000;
              auVar171._12_4_ = 0x7f800000;
              auVar171._16_4_ = 0x7f800000;
              auVar171._20_4_ = 0x7f800000;
              auVar171._24_4_ = 0x7f800000;
              auVar171._28_4_ = 0x7f800000;
              auVar116 = vblendmps_avx512vl(auVar171,auVar114);
              auVar138._0_4_ =
                   (uint)(bVar100 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar100 & 1) * 0x7f800000;
              bVar14 = (bool)(bVar100 >> 1 & 1);
              auVar138._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar100 >> 2 & 1);
              auVar138._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar100 >> 3 & 1);
              auVar138._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar100 >> 4 & 1);
              auVar138._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar100 >> 5 & 1);
              auVar138._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar100 >> 6 & 1);
              auVar138._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * 0x7f800000;
              auVar138._28_4_ =
                   (uint)(bVar100 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar100 >> 7) * 0x7f800000
              ;
              auVar116 = vshufps_avx(auVar138,auVar138,0xb1);
              auVar116 = vminps_avx(auVar138,auVar116);
              auVar127 = vshufpd_avx(auVar116,auVar116,5);
              auVar116 = vminps_avx(auVar116,auVar127);
              auVar127 = vpermpd_avx2(auVar116,0x4e);
              auVar116 = vminps_avx(auVar116,auVar127);
              uVar165 = vcmpps_avx512vl(auVar138,auVar116,0);
              bVar90 = (byte)uVar165 & bVar100;
              bVar91 = bVar100;
              if (bVar90 != 0) {
                bVar91 = bVar90;
              }
              uVar94 = 0;
              for (uVar93 = (uint)bVar91; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                uVar94 = uVar94 + 1;
              }
              uVar92 = (ulong)uVar94;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar192 = local_420[uVar92];
                uVar164 = *(undefined4 *)((long)&local_400 + uVar92 * 4);
                fVar163 = 1.0 - fVar192;
                auVar24._8_4_ = 0x80000000;
                auVar24._0_8_ = 0x8000000080000000;
                auVar24._12_4_ = 0x80000000;
                auVar110 = vxorps_avx512vl(ZEXT416((uint)fVar163),auVar24);
                auVar105 = ZEXT416((uint)(fVar192 * fVar163 * 4.0));
                auVar103 = vfnmsub213ss_fma(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),auVar105);
                auVar105 = vfmadd213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar105);
                fVar163 = fVar163 * auVar110._0_4_ * 0.5;
                fVar205 = auVar103._0_4_ * 0.5;
                fVar206 = auVar105._0_4_ * 0.5;
                fVar185 = fVar192 * fVar192 * 0.5;
                auVar193._0_4_ = fVar185 * (float)local_6d0._0_4_;
                auVar193._4_4_ = fVar185 * (float)local_6d0._4_4_;
                auVar193._8_4_ = fVar185 * (float)uStack_6c8;
                auVar193._12_4_ = fVar185 * uStack_6c8._4_4_;
                auVar180._4_4_ = fVar206;
                auVar180._0_4_ = fVar206;
                auVar180._8_4_ = fVar206;
                auVar180._12_4_ = fVar206;
                auVar105 = vfmadd132ps_fma(auVar180,auVar193,local_6c0);
                auVar194._4_4_ = fVar205;
                auVar194._0_4_ = fVar205;
                auVar194._8_4_ = fVar205;
                auVar194._12_4_ = fVar205;
                auVar215 = ZEXT3264(auVar126);
                auVar105 = vfmadd132ps_fma(auVar194,auVar105,local_6b0);
                auVar181._4_4_ = fVar163;
                auVar181._0_4_ = fVar163;
                auVar181._8_4_ = fVar163;
                auVar181._12_4_ = fVar163;
                auVar105 = vfmadd213ps_fma(auVar181,auVar21,auVar105);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar92 * 4);
                auVar190 = ZEXT3264(auVar114);
                *(int *)(ray + k * 4 + 0x180) = auVar105._0_4_;
                uVar10 = vextractps_avx(auVar105,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar10;
                uVar10 = vextractps_avx(auVar105,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar10;
                *(float *)(ray + k * 4 + 0x1e0) = fVar192;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar164;
                *(undefined4 *)(ray + k * 4 + 0x220) = uVar3;
                *(uint *)(ray + k * 4 + 0x240) = uVar98;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_3a0 = vpbroadcastd_avx512vl();
                local_3c0 = vpbroadcastd_avx512vl();
                local_5d0 = local_6b0._0_4_;
                uStack_5cc = local_6b0._4_4_;
                uStack_5c8 = local_6b0._8_8_;
                local_5e0 = local_6c0._0_8_;
                uStack_5d8 = local_6c0._8_8_;
                local_5f0 = (float)local_6d0._0_4_;
                fStack_5ec = (float)local_6d0._4_4_;
                fStack_5e8 = (float)uStack_6c8;
                fStack_5e4 = uStack_6c8._4_4_;
                local_4e0 = auVar126;
                local_4a0 = auVar114;
                local_47c = iVar9;
                local_470 = auVar21;
                local_430 = bVar100;
                do {
                  auVar233 = auVar234._0_16_;
                  local_520._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar192 = local_420[uVar92];
                  auVar178._4_4_ = fVar192;
                  auVar178._0_4_ = fVar192;
                  auVar178._8_4_ = fVar192;
                  auVar178._12_4_ = fVar192;
                  local_280._16_4_ = fVar192;
                  local_280._0_16_ = auVar178;
                  local_280._20_4_ = fVar192;
                  local_280._24_4_ = fVar192;
                  local_280._28_4_ = fVar192;
                  local_260 = *(undefined4 *)((long)&local_400 + uVar92 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar92 * 4);
                  local_740.context = context->user;
                  fVar163 = 1.0 - fVar192;
                  auVar27._8_4_ = 0x80000000;
                  auVar27._0_8_ = 0x8000000080000000;
                  auVar27._12_4_ = 0x80000000;
                  auVar110 = vxorps_avx512vl(ZEXT416((uint)fVar163),auVar27);
                  auVar105 = ZEXT416((uint)(fVar192 * fVar163 * 4.0));
                  auVar103 = vfnmsub213ss_fma(auVar178,auVar178,auVar105);
                  auVar105 = vfmadd213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar105)
                  ;
                  fVar163 = fVar163 * auVar110._0_4_ * 0.5;
                  fVar205 = auVar103._0_4_ * 0.5;
                  fVar206 = auVar105._0_4_ * 0.5;
                  fVar192 = fVar192 * fVar192 * 0.5;
                  auVar208._0_4_ = fVar192 * local_5f0;
                  auVar208._4_4_ = fVar192 * fStack_5ec;
                  auVar208._8_4_ = fVar192 * fStack_5e8;
                  auVar208._12_4_ = fVar192 * fStack_5e4;
                  auVar168._4_4_ = fVar206;
                  auVar168._0_4_ = fVar206;
                  auVar168._8_4_ = fVar206;
                  auVar168._12_4_ = fVar206;
                  auVar87._8_8_ = uStack_5d8;
                  auVar87._0_8_ = local_5e0;
                  auVar105 = vfmadd132ps_fma(auVar168,auVar208,auVar87);
                  auVar198._4_4_ = fVar205;
                  auVar198._0_4_ = fVar205;
                  auVar198._8_4_ = fVar205;
                  auVar198._12_4_ = fVar205;
                  auVar88._4_4_ = uStack_5cc;
                  auVar88._0_4_ = local_5d0;
                  auVar88._8_8_ = uStack_5c8;
                  auVar105 = vfmadd132ps_fma(auVar198,auVar105,auVar88);
                  auVar169._4_4_ = fVar163;
                  auVar169._0_4_ = fVar163;
                  auVar169._8_4_ = fVar163;
                  auVar169._12_4_ = fVar163;
                  auVar105 = vfmadd213ps_fma(auVar169,auVar21,auVar105);
                  local_2e0 = auVar105._0_4_;
                  auVar204._8_4_ = 1;
                  auVar204._0_8_ = 0x100000001;
                  auVar204._12_4_ = 1;
                  auVar204._16_4_ = 1;
                  auVar204._20_4_ = 1;
                  auVar204._24_4_ = 1;
                  auVar204._28_4_ = 1;
                  local_2c0 = vpermps_avx2(auVar204,ZEXT1632(auVar105));
                  auVar212._8_4_ = 2;
                  auVar212._0_8_ = 0x200000002;
                  auVar212._12_4_ = 2;
                  auVar212._16_4_ = 2;
                  auVar212._20_4_ = 2;
                  auVar212._24_4_ = 2;
                  auVar212._28_4_ = 2;
                  local_2a0 = vpermps_avx2(auVar212,ZEXT1632(auVar105));
                  iStack_2dc = local_2e0;
                  iStack_2d8 = local_2e0;
                  iStack_2d4 = local_2e0;
                  iStack_2d0 = local_2e0;
                  iStack_2cc = local_2e0;
                  iStack_2c8 = local_2e0;
                  iStack_2c4 = local_2e0;
                  uStack_25c = local_260;
                  uStack_258 = local_260;
                  uStack_254 = local_260;
                  uStack_250 = local_260;
                  uStack_24c = local_260;
                  uStack_248 = local_260;
                  uStack_244 = local_260;
                  local_240 = local_3c0._0_8_;
                  uStack_238 = local_3c0._8_8_;
                  uStack_230 = local_3c0._16_8_;
                  uStack_228 = local_3c0._24_8_;
                  local_220 = local_3a0;
                  auVar116 = vpcmpeqd_avx2(local_3a0,local_3a0);
                  local_708[1] = auVar116;
                  *local_708 = auVar116;
                  local_200 = (local_740.context)->instID[0];
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = (local_740.context)->instPrimID[0];
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_620 = local_300._0_8_;
                  uStack_618 = local_300._8_8_;
                  uStack_610 = local_300._16_8_;
                  uStack_608 = local_300._24_8_;
                  local_740.valid = (int *)&local_620;
                  local_740.geometryUserPtr = *(void **)(CONCAT44(uStack_59c,local_5a0) + 0x18);
                  local_740.hit = (RTCHitN *)&local_2e0;
                  local_740.N = 8;
                  pcVar13 = *(code **)(CONCAT44(uStack_59c,local_5a0) + 0x40);
                  local_580._0_8_ = uVar92;
                  local_740.ray = (RTCRayN *)ray;
                  if (pcVar13 != (code *)0x0) {
                    (*pcVar13)(&local_740);
                    auVar236 = ZEXT3264(local_6a0);
                    auVar235 = ZEXT3264(local_680);
                    auVar229 = ZEXT3264(local_700);
                    auVar230 = ZEXT3264(local_560);
                    auVar232 = ZEXT3264(local_540);
                    in_ZMM21 = ZEXT3264(local_660);
                    in_ZMM20 = ZEXT3264(local_640);
                    auVar105 = vxorps_avx512vl(auVar233,auVar233);
                    auVar234 = ZEXT1664(auVar105);
                    uVar92 = local_580._0_8_;
                    uVar219 = local_5c0._0_4_;
                  }
                  auVar105 = auVar234._0_16_;
                  auVar83._8_8_ = uStack_618;
                  auVar83._0_8_ = local_620;
                  auVar83._16_8_ = uStack_610;
                  auVar83._24_8_ = uStack_608;
                  if (auVar83 == (undefined1  [32])0x0) {
LAB_01d57922:
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_520._0_4_;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_59c,local_5a0) + 0x3e) & 0x40) != 0)))) {
                      (*p_Var12)(&local_740);
                      auVar236 = ZEXT3264(local_6a0);
                      auVar235 = ZEXT3264(local_680);
                      auVar229 = ZEXT3264(local_700);
                      auVar230 = ZEXT3264(local_560);
                      auVar232 = ZEXT3264(local_540);
                      in_ZMM21 = ZEXT3264(local_660);
                      in_ZMM20 = ZEXT3264(local_640);
                      auVar105 = vxorps_avx512vl(auVar105,auVar105);
                      auVar234 = ZEXT1664(auVar105);
                      uVar92 = local_580._0_8_;
                      uVar219 = local_5c0._0_4_;
                    }
                    auVar84._8_8_ = uStack_618;
                    auVar84._0_8_ = local_620;
                    auVar84._16_8_ = uStack_610;
                    auVar84._24_8_ = uStack_608;
                    if (auVar84 == (undefined1  [32])0x0) goto LAB_01d57922;
                    uVar96 = vptestmd_avx512vl(auVar84,auVar84);
                    iVar1 = *(int *)(local_740.hit + 4);
                    iVar2 = *(int *)(local_740.hit + 8);
                    iVar76 = *(int *)(local_740.hit + 0xc);
                    iVar77 = *(int *)(local_740.hit + 0x10);
                    iVar78 = *(int *)(local_740.hit + 0x14);
                    iVar79 = *(int *)(local_740.hit + 0x18);
                    iVar80 = *(int *)(local_740.hit + 0x1c);
                    bVar91 = (byte)uVar96;
                    bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                    bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                    bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
                    bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
                    bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
                    bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
                    bVar20 = SUB81(uVar96 >> 7,0);
                    *(uint *)(local_740.ray + 0x180) =
                         (uint)(bVar91 & 1) * *(int *)local_740.hit |
                         (uint)!(bool)(bVar91 & 1) * *(int *)(local_740.ray + 0x180);
                    *(uint *)(local_740.ray + 0x184) =
                         (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_740.ray + 0x184);
                    *(uint *)(local_740.ray + 0x188) =
                         (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_740.ray + 0x188);
                    *(uint *)(local_740.ray + 0x18c) =
                         (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_740.ray + 0x18c);
                    *(uint *)(local_740.ray + 400) =
                         (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_740.ray + 400);
                    *(uint *)(local_740.ray + 0x194) =
                         (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_740.ray + 0x194);
                    *(uint *)(local_740.ray + 0x198) =
                         (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_740.ray + 0x198);
                    *(uint *)(local_740.ray + 0x19c) =
                         (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_740.ray + 0x19c);
                    iVar1 = *(int *)(local_740.hit + 0x24);
                    iVar2 = *(int *)(local_740.hit + 0x28);
                    iVar76 = *(int *)(local_740.hit + 0x2c);
                    iVar77 = *(int *)(local_740.hit + 0x30);
                    iVar78 = *(int *)(local_740.hit + 0x34);
                    iVar79 = *(int *)(local_740.hit + 0x38);
                    iVar80 = *(int *)(local_740.hit + 0x3c);
                    bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                    bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                    bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
                    bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
                    bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
                    bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
                    bVar20 = SUB81(uVar96 >> 7,0);
                    *(uint *)(local_740.ray + 0x1a0) =
                         (uint)(bVar91 & 1) * *(int *)(local_740.hit + 0x20) |
                         (uint)!(bool)(bVar91 & 1) * *(int *)(local_740.ray + 0x1a0);
                    *(uint *)(local_740.ray + 0x1a4) =
                         (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_740.ray + 0x1a4);
                    *(uint *)(local_740.ray + 0x1a8) =
                         (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_740.ray + 0x1a8);
                    *(uint *)(local_740.ray + 0x1ac) =
                         (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_740.ray + 0x1ac);
                    *(uint *)(local_740.ray + 0x1b0) =
                         (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_740.ray + 0x1b0);
                    *(uint *)(local_740.ray + 0x1b4) =
                         (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_740.ray + 0x1b4);
                    *(uint *)(local_740.ray + 0x1b8) =
                         (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_740.ray + 0x1b8);
                    *(uint *)(local_740.ray + 0x1bc) =
                         (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_740.ray + 0x1bc);
                    iVar1 = *(int *)(local_740.hit + 0x44);
                    iVar2 = *(int *)(local_740.hit + 0x48);
                    iVar76 = *(int *)(local_740.hit + 0x4c);
                    iVar77 = *(int *)(local_740.hit + 0x50);
                    iVar78 = *(int *)(local_740.hit + 0x54);
                    iVar79 = *(int *)(local_740.hit + 0x58);
                    iVar80 = *(int *)(local_740.hit + 0x5c);
                    bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                    bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                    bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
                    bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
                    bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
                    bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
                    bVar20 = SUB81(uVar96 >> 7,0);
                    *(uint *)(local_740.ray + 0x1c0) =
                         (uint)(bVar91 & 1) * *(int *)(local_740.hit + 0x40) |
                         (uint)!(bool)(bVar91 & 1) * *(int *)(local_740.ray + 0x1c0);
                    *(uint *)(local_740.ray + 0x1c4) =
                         (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_740.ray + 0x1c4);
                    *(uint *)(local_740.ray + 0x1c8) =
                         (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_740.ray + 0x1c8);
                    *(uint *)(local_740.ray + 0x1cc) =
                         (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_740.ray + 0x1cc);
                    *(uint *)(local_740.ray + 0x1d0) =
                         (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_740.ray + 0x1d0);
                    *(uint *)(local_740.ray + 0x1d4) =
                         (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_740.ray + 0x1d4);
                    *(uint *)(local_740.ray + 0x1d8) =
                         (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_740.ray + 0x1d8);
                    *(uint *)(local_740.ray + 0x1dc) =
                         (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_740.ray + 0x1dc);
                    iVar1 = *(int *)(local_740.hit + 100);
                    iVar2 = *(int *)(local_740.hit + 0x68);
                    iVar76 = *(int *)(local_740.hit + 0x6c);
                    iVar77 = *(int *)(local_740.hit + 0x70);
                    iVar78 = *(int *)(local_740.hit + 0x74);
                    iVar79 = *(int *)(local_740.hit + 0x78);
                    iVar80 = *(int *)(local_740.hit + 0x7c);
                    bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                    bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                    bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
                    bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
                    bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
                    bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
                    bVar20 = SUB81(uVar96 >> 7,0);
                    *(uint *)(local_740.ray + 0x1e0) =
                         (uint)(bVar91 & 1) * *(int *)(local_740.hit + 0x60) |
                         (uint)!(bool)(bVar91 & 1) * *(int *)(local_740.ray + 0x1e0);
                    *(uint *)(local_740.ray + 0x1e4) =
                         (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_740.ray + 0x1e4);
                    *(uint *)(local_740.ray + 0x1e8) =
                         (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_740.ray + 0x1e8);
                    *(uint *)(local_740.ray + 0x1ec) =
                         (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_740.ray + 0x1ec);
                    *(uint *)(local_740.ray + 0x1f0) =
                         (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_740.ray + 0x1f0);
                    *(uint *)(local_740.ray + 500) =
                         (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_740.ray + 500);
                    *(uint *)(local_740.ray + 0x1f8) =
                         (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_740.ray + 0x1f8);
                    *(uint *)(local_740.ray + 0x1fc) =
                         (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_740.ray + 0x1fc);
                    auVar153._0_4_ =
                         (uint)(bVar91 & 1) * *(int *)(local_740.hit + 0x80) |
                         (uint)!(bool)(bVar91 & 1) * *(int *)(local_740.ray + 0x200);
                    bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                    auVar153._4_4_ =
                         (uint)bVar14 * *(int *)(local_740.hit + 0x84) |
                         (uint)!bVar14 * *(int *)(local_740.ray + 0x204);
                    bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
                    auVar153._8_4_ =
                         (uint)bVar14 * *(int *)(local_740.hit + 0x88) |
                         (uint)!bVar14 * *(int *)(local_740.ray + 0x208);
                    bVar14 = (bool)((byte)(uVar96 >> 3) & 1);
                    auVar153._12_4_ =
                         (uint)bVar14 * *(int *)(local_740.hit + 0x8c) |
                         (uint)!bVar14 * *(int *)(local_740.ray + 0x20c);
                    bVar14 = (bool)((byte)(uVar96 >> 4) & 1);
                    auVar153._16_4_ =
                         (uint)bVar14 * *(int *)(local_740.hit + 0x90) |
                         (uint)!bVar14 * *(int *)(local_740.ray + 0x210);
                    bVar14 = (bool)((byte)(uVar96 >> 5) & 1);
                    auVar153._20_4_ =
                         (uint)bVar14 * *(int *)(local_740.hit + 0x94) |
                         (uint)!bVar14 * *(int *)(local_740.ray + 0x214);
                    bVar14 = (bool)((byte)(uVar96 >> 6) & 1);
                    auVar153._24_4_ =
                         (uint)bVar14 * *(int *)(local_740.hit + 0x98) |
                         (uint)!bVar14 * *(int *)(local_740.ray + 0x218);
                    bVar14 = SUB81(uVar96 >> 7,0);
                    auVar153._28_4_ =
                         (uint)bVar14 * *(int *)(local_740.hit + 0x9c) |
                         (uint)!bVar14 * *(int *)(local_740.ray + 0x21c);
                    *(undefined1 (*) [32])(local_740.ray + 0x200) = auVar153;
                    auVar116 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_740.hit + 0xa0));
                    *(undefined1 (*) [32])(local_740.ray + 0x220) = auVar116;
                    auVar116 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_740.hit + 0xc0));
                    *(undefined1 (*) [32])(local_740.ray + 0x240) = auVar116;
                    auVar116 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_740.hit + 0xe0));
                    *(undefined1 (*) [32])(local_740.ray + 0x260) = auVar116;
                    auVar116 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_740.hit + 0x100));
                    *(undefined1 (*) [32])(local_740.ray + 0x280) = auVar116;
                  }
                  auVar215 = ZEXT3264(auVar126);
                  auVar190 = ZEXT3264(auVar114);
                  bVar91 = ~(byte)(1 << ((uint)uVar92 & 0x1f)) & bVar100;
                  uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar38._4_4_ = uVar164;
                  auVar38._0_4_ = uVar164;
                  auVar38._8_4_ = uVar164;
                  auVar38._12_4_ = uVar164;
                  auVar38._16_4_ = uVar164;
                  auVar38._20_4_ = uVar164;
                  auVar38._24_4_ = uVar164;
                  auVar38._28_4_ = uVar164;
                  uVar165 = vcmpps_avx512vl(auVar114,auVar38,2);
                  bVar100 = bVar91 & (byte)uVar165;
                  if ((bVar91 & (byte)uVar165) != 0) {
                    auVar176._8_4_ = 0x7f800000;
                    auVar176._0_8_ = 0x7f8000007f800000;
                    auVar176._12_4_ = 0x7f800000;
                    auVar176._16_4_ = 0x7f800000;
                    auVar176._20_4_ = 0x7f800000;
                    auVar176._24_4_ = 0x7f800000;
                    auVar176._28_4_ = 0x7f800000;
                    auVar116 = vblendmps_avx512vl(auVar176,auVar114);
                    auVar154._0_4_ =
                         (uint)(bVar100 & 1) * auVar116._0_4_ |
                         (uint)!(bool)(bVar100 & 1) * 0x7f800000;
                    bVar14 = (bool)(bVar100 >> 1 & 1);
                    auVar154._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar100 >> 2 & 1);
                    auVar154._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar100 >> 3 & 1);
                    auVar154._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar100 >> 4 & 1);
                    auVar154._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar100 >> 5 & 1);
                    auVar154._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar100 >> 6 & 1);
                    auVar154._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * 0x7f800000;
                    auVar154._28_4_ =
                         (uint)(bVar100 >> 7) * auVar116._28_4_ |
                         (uint)!(bool)(bVar100 >> 7) * 0x7f800000;
                    auVar116 = vshufps_avx(auVar154,auVar154,0xb1);
                    auVar116 = vminps_avx(auVar154,auVar116);
                    auVar127 = vshufpd_avx(auVar116,auVar116,5);
                    auVar116 = vminps_avx(auVar116,auVar127);
                    auVar127 = vpermpd_avx2(auVar116,0x4e);
                    auVar116 = vminps_avx(auVar116,auVar127);
                    uVar165 = vcmpps_avx512vl(auVar154,auVar116,0);
                    bVar90 = (byte)uVar165 & bVar100;
                    bVar91 = bVar100;
                    if (bVar90 != 0) {
                      bVar91 = bVar90;
                    }
                    uVar94 = 0;
                    for (uVar93 = (uint)bVar91; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000
                        ) {
                      uVar94 = uVar94 + 1;
                    }
                    uVar92 = (ulong)uVar94;
                  }
                } while (bVar100 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar9) {
        local_580 = vpbroadcastd_avx512vl();
        local_520 = vbroadcastss_avx512vl(auVar106);
        fStack_5b0 = 1.0 / (float)local_500._0_4_;
        local_5c0._4_4_ = fStack_5b0;
        local_5c0._0_4_ = fStack_5b0;
        fStack_5b8 = fStack_5b0;
        fStack_5b4 = fStack_5b0;
        local_500 = vpbroadcastd_avx512vl();
        local_3a0 = vpbroadcastd_avx512vl();
        lVar97 = 8;
        auVar114 = auVar215._0_32_;
        auVar116 = auVar190._0_32_;
        fStack_5ac = fStack_5b0;
        fStack_5a8 = fStack_5b0;
        fStack_5a4 = fStack_5b0;
        local_5a0 = uVar219;
        uStack_59c = uVar219;
        uStack_598 = uVar219;
        uStack_594 = uVar219;
        uStack_590 = uVar219;
        uStack_58c = uVar219;
        uStack_588 = uVar219;
        uStack_584 = uVar219;
        do {
          auVar126 = vpbroadcastd_avx512vl();
          auVar117 = vpor_avx2(auVar126,_DAT_0205a920);
          uVar22 = vpcmpd_avx512vl(auVar117,local_580,1);
          auVar126 = *(undefined1 (*) [32])(bspline_basis0 + lVar97 * 4 + lVar23);
          auVar127 = *(undefined1 (*) [32])(lVar23 + 0x222bfac + lVar97 * 4);
          auVar125 = *(undefined1 (*) [32])(lVar23 + 0x222c430 + lVar97 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar23 + 0x222c8b4 + lVar97 * 4);
          local_680 = auVar235._0_32_;
          auVar118 = vmulps_avx512vl(local_680,auVar115);
          local_6a0 = auVar236._0_32_;
          auVar124 = vmulps_avx512vl(local_6a0,auVar115);
          auVar56._4_4_ = auVar115._4_4_ * (float)local_140._4_4_;
          auVar56._0_4_ = auVar115._0_4_ * (float)local_140._0_4_;
          auVar56._8_4_ = auVar115._8_4_ * fStack_138;
          auVar56._12_4_ = auVar115._12_4_ * fStack_134;
          auVar56._16_4_ = auVar115._16_4_ * fStack_130;
          auVar56._20_4_ = auVar115._20_4_ * fStack_12c;
          auVar56._24_4_ = auVar115._24_4_ * fStack_128;
          auVar56._28_4_ = auVar117._28_4_;
          auVar117 = vfmadd231ps_avx512vl(auVar118,auVar125,local_a0);
          auVar118 = vfmadd231ps_avx512vl(auVar124,auVar125,local_c0);
          auVar124 = vfmadd231ps_avx512vl(auVar56,auVar125,local_120);
          auVar213 = auVar229._0_32_;
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar127,auVar213);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar127,local_340);
          auVar106 = vfmadd231ps_fma(auVar124,auVar127,local_100);
          auVar216 = auVar232._0_32_;
          auVar120 = vfmadd231ps_avx512vl(auVar117,auVar126,auVar216);
          auVar214 = auVar230._0_32_;
          auVar111 = vfmadd231ps_avx512vl(auVar118,auVar126,auVar214);
          auVar117 = *(undefined1 (*) [32])(bspline_basis1 + lVar97 * 4 + lVar23);
          auVar118 = *(undefined1 (*) [32])(lVar23 + 0x222e3cc + lVar97 * 4);
          auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar126,local_e0);
          auVar124 = *(undefined1 (*) [32])(lVar23 + 0x222e850 + lVar97 * 4);
          auVar123 = *(undefined1 (*) [32])(lVar23 + 0x222ecd4 + lVar97 * 4);
          auVar113 = vmulps_avx512vl(local_680,auVar123);
          auVar119 = vmulps_avx512vl(local_6a0,auVar123);
          auVar57._4_4_ = auVar123._4_4_ * (float)local_140._4_4_;
          auVar57._0_4_ = auVar123._0_4_ * (float)local_140._0_4_;
          auVar57._8_4_ = auVar123._8_4_ * fStack_138;
          auVar57._12_4_ = auVar123._12_4_ * fStack_134;
          auVar57._16_4_ = auVar123._16_4_ * fStack_130;
          auVar57._20_4_ = auVar123._20_4_ * fStack_12c;
          auVar57._24_4_ = auVar123._24_4_ * fStack_128;
          auVar57._28_4_ = uStack_124;
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar124,local_a0);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar124,local_c0);
          auVar112 = vfmadd231ps_avx512vl(auVar57,auVar124,local_120);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar118,auVar213);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar118,local_340);
          auVar105 = vfmadd231ps_fma(auVar112,auVar118,local_100);
          auVar112 = vfmadd231ps_avx512vl(auVar113,auVar117,auVar216);
          auVar121 = vfmadd231ps_avx512vl(auVar119,auVar117,auVar214);
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar117,local_e0);
          auVar122 = vmaxps_avx512vl(ZEXT1632(auVar106),ZEXT1632(auVar105));
          auVar113 = vsubps_avx(auVar112,auVar120);
          auVar119 = vsubps_avx(auVar121,auVar111);
          auVar139 = vmulps_avx512vl(auVar111,auVar113);
          auVar140 = vmulps_avx512vl(auVar120,auVar119);
          auVar139 = vsubps_avx512vl(auVar139,auVar140);
          auVar140 = vmulps_avx512vl(auVar119,auVar119);
          auVar140 = vfmadd231ps_avx512vl(auVar140,auVar113,auVar113);
          auVar122 = vmulps_avx512vl(auVar122,auVar122);
          auVar122 = vmulps_avx512vl(auVar122,auVar140);
          auVar139 = vmulps_avx512vl(auVar139,auVar139);
          uVar165 = vcmpps_avx512vl(auVar139,auVar122,2);
          local_430 = (byte)uVar22 & (byte)uVar165;
          if (local_430 == 0) {
            auVar231 = ZEXT3264(auVar214);
            auVar229 = ZEXT3264(auVar213);
          }
          else {
            auVar123 = vmulps_avx512vl(local_1c0,auVar123);
            auVar124 = vfmadd213ps_avx512vl(auVar124,local_1a0,auVar123);
            auVar118 = vfmadd213ps_avx512vl(auVar118,local_180,auVar124);
            auVar117 = vfmadd213ps_avx512vl(auVar117,local_160,auVar118);
            auVar115 = vmulps_avx512vl(local_1c0,auVar115);
            auVar125 = vfmadd213ps_avx512vl(auVar125,local_1a0,auVar115);
            auVar127 = vfmadd213ps_avx512vl(auVar127,local_180,auVar125);
            auVar118 = vfmadd213ps_avx512vl(auVar126,local_160,auVar127);
            auVar126 = *(undefined1 (*) [32])(lVar23 + 0x222cd38 + lVar97 * 4);
            auVar127 = *(undefined1 (*) [32])(lVar23 + 0x222d1bc + lVar97 * 4);
            auVar125 = *(undefined1 (*) [32])(lVar23 + 0x222d640 + lVar97 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar23 + 0x222dac4 + lVar97 * 4);
            auVar124 = vmulps_avx512vl(local_680,auVar115);
            auVar123 = vmulps_avx512vl(local_6a0,auVar115);
            auVar115 = vmulps_avx512vl(local_1c0,auVar115);
            auVar124 = vfmadd231ps_avx512vl(auVar124,auVar125,local_a0);
            auVar123 = vfmadd231ps_avx512vl(auVar123,auVar125,local_c0);
            auVar125 = vfmadd231ps_avx512vl(auVar115,local_1a0,auVar125);
            auVar115 = vfmadd231ps_avx512vl(auVar124,auVar127,auVar213);
            auVar124 = vfmadd231ps_avx512vl(auVar123,auVar127,local_340);
            auVar127 = vfmadd231ps_avx512vl(auVar125,local_180,auVar127);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar126,auVar216);
            auVar124 = vfmadd231ps_avx512vl(auVar124,auVar126,auVar214);
            auVar123 = vfmadd231ps_avx512vl(auVar127,local_160,auVar126);
            auVar126 = *(undefined1 (*) [32])(lVar23 + 0x222f158 + lVar97 * 4);
            auVar127 = *(undefined1 (*) [32])(lVar23 + 0x222fa60 + lVar97 * 4);
            auVar125 = *(undefined1 (*) [32])(lVar23 + 0x222fee4 + lVar97 * 4);
            auVar122 = vmulps_avx512vl(local_680,auVar125);
            auVar139 = vmulps_avx512vl(local_6a0,auVar125);
            auVar125 = vmulps_avx512vl(local_1c0,auVar125);
            auVar122 = vfmadd231ps_avx512vl(auVar122,auVar127,local_a0);
            auVar139 = vfmadd231ps_avx512vl(auVar139,auVar127,local_c0);
            auVar125 = vfmadd231ps_avx512vl(auVar125,local_1a0,auVar127);
            auVar127 = *(undefined1 (*) [32])(lVar23 + 0x222f5dc + lVar97 * 4);
            auVar122 = vfmadd231ps_avx512vl(auVar122,auVar127,auVar213);
            auVar103 = vfmadd231ps_fma(auVar139,auVar127,local_340);
            auVar127 = vfmadd231ps_avx512vl(auVar125,local_180,auVar127);
            auVar125 = vfmadd231ps_avx512vl(auVar122,auVar126,auVar216);
            auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar126,auVar214);
            auVar127 = vfmadd231ps_avx512vl(auVar127,local_160,auVar126);
            auVar139 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar115,auVar139);
            vandps_avx512vl(auVar124,auVar139);
            auVar126 = vmaxps_avx(auVar139,auVar139);
            vandps_avx512vl(auVar123,auVar139);
            auVar126 = vmaxps_avx(auVar126,auVar139);
            uVar92 = vcmpps_avx512vl(auVar126,local_520,1);
            bVar14 = (bool)((byte)uVar92 & 1);
            auVar141._0_4_ = (float)((uint)bVar14 * auVar113._0_4_ | (uint)!bVar14 * auVar115._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar141._4_4_ = (float)((uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar115._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar141._8_4_ = (float)((uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar115._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar141._12_4_ =
                 (float)((uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar115._12_4_);
            bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
            auVar141._16_4_ =
                 (float)((uint)bVar14 * auVar113._16_4_ | (uint)!bVar14 * auVar115._16_4_);
            bVar14 = (bool)((byte)(uVar92 >> 5) & 1);
            auVar141._20_4_ =
                 (float)((uint)bVar14 * auVar113._20_4_ | (uint)!bVar14 * auVar115._20_4_);
            bVar14 = (bool)((byte)(uVar92 >> 6) & 1);
            auVar141._24_4_ =
                 (float)((uint)bVar14 * auVar113._24_4_ | (uint)!bVar14 * auVar115._24_4_);
            bVar14 = SUB81(uVar92 >> 7,0);
            auVar141._28_4_ = (uint)bVar14 * auVar113._28_4_ | (uint)!bVar14 * auVar115._28_4_;
            bVar14 = (bool)((byte)uVar92 & 1);
            auVar142._0_4_ = (float)((uint)bVar14 * auVar119._0_4_ | (uint)!bVar14 * auVar124._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar142._4_4_ = (float)((uint)bVar14 * auVar119._4_4_ | (uint)!bVar14 * auVar124._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar142._8_4_ = (float)((uint)bVar14 * auVar119._8_4_ | (uint)!bVar14 * auVar124._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar142._12_4_ =
                 (float)((uint)bVar14 * auVar119._12_4_ | (uint)!bVar14 * auVar124._12_4_);
            bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
            auVar142._16_4_ =
                 (float)((uint)bVar14 * auVar119._16_4_ | (uint)!bVar14 * auVar124._16_4_);
            bVar14 = (bool)((byte)(uVar92 >> 5) & 1);
            auVar142._20_4_ =
                 (float)((uint)bVar14 * auVar119._20_4_ | (uint)!bVar14 * auVar124._20_4_);
            bVar14 = (bool)((byte)(uVar92 >> 6) & 1);
            auVar142._24_4_ =
                 (float)((uint)bVar14 * auVar119._24_4_ | (uint)!bVar14 * auVar124._24_4_);
            bVar14 = SUB81(uVar92 >> 7,0);
            auVar142._28_4_ = (uint)bVar14 * auVar119._28_4_ | (uint)!bVar14 * auVar124._28_4_;
            vandps_avx512vl(auVar125,auVar139);
            vandps_avx512vl(auVar122,auVar139);
            auVar126 = vmaxps_avx(auVar142,auVar142);
            vandps_avx512vl(auVar127,auVar139);
            auVar126 = vmaxps_avx(auVar126,auVar142);
            uVar92 = vcmpps_avx512vl(auVar126,local_520,1);
            bVar14 = (bool)((byte)uVar92 & 1);
            auVar143._0_4_ = (uint)bVar14 * auVar113._0_4_ | (uint)!bVar14 * auVar125._0_4_;
            bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar143._4_4_ = (uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar125._4_4_;
            bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar143._8_4_ = (uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar125._8_4_;
            bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar143._12_4_ = (uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar125._12_4_;
            bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
            auVar143._16_4_ = (uint)bVar14 * auVar113._16_4_ | (uint)!bVar14 * auVar125._16_4_;
            bVar14 = (bool)((byte)(uVar92 >> 5) & 1);
            auVar143._20_4_ = (uint)bVar14 * auVar113._20_4_ | (uint)!bVar14 * auVar125._20_4_;
            bVar14 = (bool)((byte)(uVar92 >> 6) & 1);
            auVar143._24_4_ = (uint)bVar14 * auVar113._24_4_ | (uint)!bVar14 * auVar125._24_4_;
            bVar14 = SUB81(uVar92 >> 7,0);
            auVar143._28_4_ = (uint)bVar14 * auVar113._28_4_ | (uint)!bVar14 * auVar125._28_4_;
            bVar14 = (bool)((byte)uVar92 & 1);
            auVar144._0_4_ = (float)((uint)bVar14 * auVar119._0_4_ | (uint)!bVar14 * auVar122._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar144._4_4_ = (float)((uint)bVar14 * auVar119._4_4_ | (uint)!bVar14 * auVar122._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar144._8_4_ = (float)((uint)bVar14 * auVar119._8_4_ | (uint)!bVar14 * auVar122._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar144._12_4_ =
                 (float)((uint)bVar14 * auVar119._12_4_ | (uint)!bVar14 * auVar122._12_4_);
            bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
            auVar144._16_4_ =
                 (float)((uint)bVar14 * auVar119._16_4_ | (uint)!bVar14 * auVar122._16_4_);
            bVar14 = (bool)((byte)(uVar92 >> 5) & 1);
            auVar144._20_4_ =
                 (float)((uint)bVar14 * auVar119._20_4_ | (uint)!bVar14 * auVar122._20_4_);
            bVar14 = (bool)((byte)(uVar92 >> 6) & 1);
            auVar144._24_4_ =
                 (float)((uint)bVar14 * auVar119._24_4_ | (uint)!bVar14 * auVar122._24_4_);
            bVar14 = SUB81(uVar92 >> 7,0);
            auVar144._28_4_ = (uint)bVar14 * auVar119._28_4_ | (uint)!bVar14 * auVar122._28_4_;
            auVar220._8_4_ = 0x80000000;
            auVar220._0_8_ = 0x8000000080000000;
            auVar220._12_4_ = 0x80000000;
            auVar220._16_4_ = 0x80000000;
            auVar220._20_4_ = 0x80000000;
            auVar220._24_4_ = 0x80000000;
            auVar220._28_4_ = 0x80000000;
            auVar126 = vxorps_avx512vl(auVar143,auVar220);
            auVar122 = auVar234._0_32_;
            auVar127 = vfmadd213ps_avx512vl(auVar141,auVar141,auVar122);
            auVar103 = vfmadd231ps_fma(auVar127,auVar142,auVar142);
            auVar127 = vrsqrt14ps_avx512vl(ZEXT1632(auVar103));
            auVar228._8_4_ = 0xbf000000;
            auVar228._0_8_ = 0xbf000000bf000000;
            auVar228._12_4_ = 0xbf000000;
            auVar228._16_4_ = 0xbf000000;
            auVar228._20_4_ = 0xbf000000;
            auVar228._24_4_ = 0xbf000000;
            auVar228._28_4_ = 0xbf000000;
            fVar192 = auVar127._0_4_;
            fVar163 = auVar127._4_4_;
            fVar205 = auVar127._8_4_;
            fVar206 = auVar127._12_4_;
            fVar185 = auVar127._16_4_;
            fVar191 = auVar127._20_4_;
            fVar101 = auVar127._24_4_;
            auVar58._4_4_ = fVar163 * fVar163 * fVar163 * auVar103._4_4_ * -0.5;
            auVar58._0_4_ = fVar192 * fVar192 * fVar192 * auVar103._0_4_ * -0.5;
            auVar58._8_4_ = fVar205 * fVar205 * fVar205 * auVar103._8_4_ * -0.5;
            auVar58._12_4_ = fVar206 * fVar206 * fVar206 * auVar103._12_4_ * -0.5;
            auVar58._16_4_ = fVar185 * fVar185 * fVar185 * -0.0;
            auVar58._20_4_ = fVar191 * fVar191 * fVar191 * -0.0;
            auVar58._24_4_ = fVar101 * fVar101 * fVar101 * -0.0;
            auVar58._28_4_ = auVar142._28_4_;
            auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar127 = vfmadd231ps_avx512vl(auVar58,auVar125,auVar127);
            auVar59._4_4_ = auVar142._4_4_ * auVar127._4_4_;
            auVar59._0_4_ = auVar142._0_4_ * auVar127._0_4_;
            auVar59._8_4_ = auVar142._8_4_ * auVar127._8_4_;
            auVar59._12_4_ = auVar142._12_4_ * auVar127._12_4_;
            auVar59._16_4_ = auVar142._16_4_ * auVar127._16_4_;
            auVar59._20_4_ = auVar142._20_4_ * auVar127._20_4_;
            auVar59._24_4_ = auVar142._24_4_ * auVar127._24_4_;
            auVar59._28_4_ = 0;
            auVar60._4_4_ = auVar127._4_4_ * -auVar141._4_4_;
            auVar60._0_4_ = auVar127._0_4_ * -auVar141._0_4_;
            auVar60._8_4_ = auVar127._8_4_ * -auVar141._8_4_;
            auVar60._12_4_ = auVar127._12_4_ * -auVar141._12_4_;
            auVar60._16_4_ = auVar127._16_4_ * -auVar141._16_4_;
            auVar60._20_4_ = auVar127._20_4_ * -auVar141._20_4_;
            auVar60._24_4_ = auVar127._24_4_ * -auVar141._24_4_;
            auVar60._28_4_ = auVar142._28_4_;
            auVar115 = vmulps_avx512vl(auVar127,auVar122);
            auVar127 = vfmadd213ps_avx512vl(auVar143,auVar143,auVar122);
            auVar127 = vfmadd231ps_avx512vl(auVar127,auVar144,auVar144);
            auVar124 = vrsqrt14ps_avx512vl(auVar127);
            auVar127 = vmulps_avx512vl(auVar127,auVar228);
            fVar192 = auVar124._0_4_;
            fVar163 = auVar124._4_4_;
            fVar205 = auVar124._8_4_;
            fVar206 = auVar124._12_4_;
            fVar185 = auVar124._16_4_;
            fVar191 = auVar124._20_4_;
            fVar101 = auVar124._24_4_;
            auVar61._4_4_ = fVar163 * fVar163 * fVar163 * auVar127._4_4_;
            auVar61._0_4_ = fVar192 * fVar192 * fVar192 * auVar127._0_4_;
            auVar61._8_4_ = fVar205 * fVar205 * fVar205 * auVar127._8_4_;
            auVar61._12_4_ = fVar206 * fVar206 * fVar206 * auVar127._12_4_;
            auVar61._16_4_ = fVar185 * fVar185 * fVar185 * auVar127._16_4_;
            auVar61._20_4_ = fVar191 * fVar191 * fVar191 * auVar127._20_4_;
            auVar61._24_4_ = fVar101 * fVar101 * fVar101 * auVar127._24_4_;
            auVar61._28_4_ = auVar127._28_4_;
            auVar127 = vfmadd231ps_avx512vl(auVar61,auVar125,auVar124);
            auVar62._4_4_ = auVar144._4_4_ * auVar127._4_4_;
            auVar62._0_4_ = auVar144._0_4_ * auVar127._0_4_;
            auVar62._8_4_ = auVar144._8_4_ * auVar127._8_4_;
            auVar62._12_4_ = auVar144._12_4_ * auVar127._12_4_;
            auVar62._16_4_ = auVar144._16_4_ * auVar127._16_4_;
            auVar62._20_4_ = auVar144._20_4_ * auVar127._20_4_;
            auVar62._24_4_ = auVar144._24_4_ * auVar127._24_4_;
            auVar62._28_4_ = auVar124._28_4_;
            auVar63._4_4_ = auVar127._4_4_ * auVar126._4_4_;
            auVar63._0_4_ = auVar127._0_4_ * auVar126._0_4_;
            auVar63._8_4_ = auVar127._8_4_ * auVar126._8_4_;
            auVar63._12_4_ = auVar127._12_4_ * auVar126._12_4_;
            auVar63._16_4_ = auVar127._16_4_ * auVar126._16_4_;
            auVar63._20_4_ = auVar127._20_4_ * auVar126._20_4_;
            auVar63._24_4_ = auVar127._24_4_ * auVar126._24_4_;
            auVar63._28_4_ = auVar126._28_4_;
            auVar126 = vmulps_avx512vl(auVar127,auVar122);
            auVar103 = vfmadd213ps_fma(auVar59,ZEXT1632(auVar106),auVar120);
            auVar127 = ZEXT1632(auVar106);
            auVar110 = vfmadd213ps_fma(auVar60,auVar127,auVar111);
            auVar125 = vfmadd213ps_avx512vl(auVar115,auVar127,auVar118);
            auVar124 = vfmadd213ps_avx512vl(auVar62,ZEXT1632(auVar105),auVar112);
            auVar107 = vfnmadd213ps_fma(auVar59,auVar127,auVar120);
            auVar123 = ZEXT1632(auVar105);
            auVar233 = vfmadd213ps_fma(auVar63,auVar123,auVar121);
            auVar108 = vfnmadd213ps_fma(auVar60,auVar127,auVar111);
            auVar6 = vfmadd213ps_fma(auVar126,auVar123,auVar117);
            auVar111 = ZEXT1632(auVar106);
            auVar218 = vfnmadd231ps_fma(auVar118,auVar111,auVar115);
            auVar186 = vfnmadd213ps_fma(auVar62,auVar123,auVar112);
            auVar187 = vfnmadd213ps_fma(auVar63,auVar123,auVar121);
            auVar109 = vfnmadd231ps_fma(auVar117,ZEXT1632(auVar105),auVar126);
            auVar117 = vsubps_avx512vl(auVar124,ZEXT1632(auVar107));
            auVar126 = vsubps_avx(ZEXT1632(auVar233),ZEXT1632(auVar108));
            auVar127 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar218));
            auVar64._4_4_ = auVar126._4_4_ * auVar218._4_4_;
            auVar64._0_4_ = auVar126._0_4_ * auVar218._0_4_;
            auVar64._8_4_ = auVar126._8_4_ * auVar218._8_4_;
            auVar64._12_4_ = auVar126._12_4_ * auVar218._12_4_;
            auVar64._16_4_ = auVar126._16_4_ * 0.0;
            auVar64._20_4_ = auVar126._20_4_ * 0.0;
            auVar64._24_4_ = auVar126._24_4_ * 0.0;
            auVar64._28_4_ = auVar115._28_4_;
            auVar106 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar108),auVar127);
            auVar65._4_4_ = auVar127._4_4_ * auVar107._4_4_;
            auVar65._0_4_ = auVar127._0_4_ * auVar107._0_4_;
            auVar65._8_4_ = auVar127._8_4_ * auVar107._8_4_;
            auVar65._12_4_ = auVar127._12_4_ * auVar107._12_4_;
            auVar65._16_4_ = auVar127._16_4_ * 0.0;
            auVar65._20_4_ = auVar127._20_4_ * 0.0;
            auVar65._24_4_ = auVar127._24_4_ * 0.0;
            auVar65._28_4_ = auVar127._28_4_;
            auVar7 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar218),auVar117);
            auVar66._4_4_ = auVar108._4_4_ * auVar117._4_4_;
            auVar66._0_4_ = auVar108._0_4_ * auVar117._0_4_;
            auVar66._8_4_ = auVar108._8_4_ * auVar117._8_4_;
            auVar66._12_4_ = auVar108._12_4_ * auVar117._12_4_;
            auVar66._16_4_ = auVar117._16_4_ * 0.0;
            auVar66._20_4_ = auVar117._20_4_ * 0.0;
            auVar66._24_4_ = auVar117._24_4_ * 0.0;
            auVar66._28_4_ = auVar117._28_4_;
            auVar104 = vfmsub231ps_fma(auVar66,ZEXT1632(auVar107),auVar126);
            auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar122,ZEXT1632(auVar7));
            auVar126 = vfmadd231ps_avx512vl(auVar126,auVar122,ZEXT1632(auVar106));
            uVar92 = vcmpps_avx512vl(auVar126,auVar122,2);
            bVar100 = (byte)uVar92;
            fVar155 = (float)((uint)(bVar100 & 1) * auVar103._0_4_ |
                             (uint)!(bool)(bVar100 & 1) * auVar186._0_4_);
            bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
            fVar157 = (float)((uint)bVar14 * auVar103._4_4_ | (uint)!bVar14 * auVar186._4_4_);
            bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
            fVar160 = (float)((uint)bVar14 * auVar103._8_4_ | (uint)!bVar14 * auVar186._8_4_);
            bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
            fVar161 = (float)((uint)bVar14 * auVar103._12_4_ | (uint)!bVar14 * auVar186._12_4_);
            auVar123 = ZEXT1632(CONCAT412(fVar161,CONCAT48(fVar160,CONCAT44(fVar157,fVar155))));
            fVar156 = (float)((uint)(bVar100 & 1) * auVar110._0_4_ |
                             (uint)!(bool)(bVar100 & 1) * auVar187._0_4_);
            bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
            fVar159 = (float)((uint)bVar14 * auVar110._4_4_ | (uint)!bVar14 * auVar187._4_4_);
            bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
            fVar158 = (float)((uint)bVar14 * auVar110._8_4_ | (uint)!bVar14 * auVar187._8_4_);
            bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
            fVar162 = (float)((uint)bVar14 * auVar110._12_4_ | (uint)!bVar14 * auVar187._12_4_);
            auVar113 = ZEXT1632(CONCAT412(fVar162,CONCAT48(fVar158,CONCAT44(fVar159,fVar156))));
            auVar145._0_4_ =
                 (float)((uint)(bVar100 & 1) * auVar125._0_4_ |
                        (uint)!(bool)(bVar100 & 1) * auVar109._0_4_);
            bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar145._4_4_ = (float)((uint)bVar14 * auVar125._4_4_ | (uint)!bVar14 * auVar109._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar145._8_4_ = (float)((uint)bVar14 * auVar125._8_4_ | (uint)!bVar14 * auVar109._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar145._12_4_ =
                 (float)((uint)bVar14 * auVar125._12_4_ | (uint)!bVar14 * auVar109._12_4_);
            fVar192 = (float)((uint)((byte)(uVar92 >> 4) & 1) * auVar125._16_4_);
            auVar145._16_4_ = fVar192;
            fVar163 = (float)((uint)((byte)(uVar92 >> 5) & 1) * auVar125._20_4_);
            auVar145._20_4_ = fVar163;
            fVar205 = (float)((uint)((byte)(uVar92 >> 6) & 1) * auVar125._24_4_);
            auVar145._24_4_ = fVar205;
            iVar1 = (uint)(byte)(uVar92 >> 7) * auVar125._28_4_;
            auVar145._28_4_ = iVar1;
            auVar126 = vblendmps_avx512vl(ZEXT1632(auVar107),auVar124);
            auVar146._0_4_ =
                 (uint)(bVar100 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar100 & 1) * auVar106._0_4_;
            bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar146._4_4_ = (uint)bVar14 * auVar126._4_4_ | (uint)!bVar14 * auVar106._4_4_;
            bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar146._8_4_ = (uint)bVar14 * auVar126._8_4_ | (uint)!bVar14 * auVar106._8_4_;
            bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar146._12_4_ = (uint)bVar14 * auVar126._12_4_ | (uint)!bVar14 * auVar106._12_4_;
            auVar146._16_4_ = (uint)((byte)(uVar92 >> 4) & 1) * auVar126._16_4_;
            auVar146._20_4_ = (uint)((byte)(uVar92 >> 5) & 1) * auVar126._20_4_;
            auVar146._24_4_ = (uint)((byte)(uVar92 >> 6) & 1) * auVar126._24_4_;
            auVar146._28_4_ = (uint)(byte)(uVar92 >> 7) * auVar126._28_4_;
            auVar126 = vblendmps_avx512vl(ZEXT1632(auVar108),ZEXT1632(auVar233));
            auVar147._0_4_ =
                 (float)((uint)(bVar100 & 1) * auVar126._0_4_ |
                        (uint)!(bool)(bVar100 & 1) * auVar103._0_4_);
            bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar147._4_4_ = (float)((uint)bVar14 * auVar126._4_4_ | (uint)!bVar14 * auVar103._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar147._8_4_ = (float)((uint)bVar14 * auVar126._8_4_ | (uint)!bVar14 * auVar103._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar147._12_4_ =
                 (float)((uint)bVar14 * auVar126._12_4_ | (uint)!bVar14 * auVar103._12_4_);
            fVar185 = (float)((uint)((byte)(uVar92 >> 4) & 1) * auVar126._16_4_);
            auVar147._16_4_ = fVar185;
            fVar191 = (float)((uint)((byte)(uVar92 >> 5) & 1) * auVar126._20_4_);
            auVar147._20_4_ = fVar191;
            fVar206 = (float)((uint)((byte)(uVar92 >> 6) & 1) * auVar126._24_4_);
            auVar147._24_4_ = fVar206;
            auVar147._28_4_ = (uint)(byte)(uVar92 >> 7) * auVar126._28_4_;
            auVar126 = vblendmps_avx512vl(ZEXT1632(auVar218),ZEXT1632(auVar6));
            auVar148._0_4_ =
                 (float)((uint)(bVar100 & 1) * auVar126._0_4_ |
                        (uint)!(bool)(bVar100 & 1) * auVar110._0_4_);
            bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar148._4_4_ = (float)((uint)bVar14 * auVar126._4_4_ | (uint)!bVar14 * auVar110._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar148._8_4_ = (float)((uint)bVar14 * auVar126._8_4_ | (uint)!bVar14 * auVar110._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar148._12_4_ =
                 (float)((uint)bVar14 * auVar126._12_4_ | (uint)!bVar14 * auVar110._12_4_);
            fVar184 = (float)((uint)((byte)(uVar92 >> 4) & 1) * auVar126._16_4_);
            auVar148._16_4_ = fVar184;
            fVar101 = (float)((uint)((byte)(uVar92 >> 5) & 1) * auVar126._20_4_);
            auVar148._20_4_ = fVar101;
            fVar102 = (float)((uint)((byte)(uVar92 >> 6) & 1) * auVar126._24_4_);
            auVar148._24_4_ = fVar102;
            iVar2 = (uint)(byte)(uVar92 >> 7) * auVar126._28_4_;
            auVar148._28_4_ = iVar2;
            auVar149._0_4_ =
                 (uint)(bVar100 & 1) * (int)auVar107._0_4_ |
                 (uint)!(bool)(bVar100 & 1) * auVar124._0_4_;
            bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar149._4_4_ = (uint)bVar14 * (int)auVar107._4_4_ | (uint)!bVar14 * auVar124._4_4_;
            bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar149._8_4_ = (uint)bVar14 * (int)auVar107._8_4_ | (uint)!bVar14 * auVar124._8_4_;
            bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar149._12_4_ = (uint)bVar14 * (int)auVar107._12_4_ | (uint)!bVar14 * auVar124._12_4_;
            auVar149._16_4_ = (uint)!(bool)((byte)(uVar92 >> 4) & 1) * auVar124._16_4_;
            auVar149._20_4_ = (uint)!(bool)((byte)(uVar92 >> 5) & 1) * auVar124._20_4_;
            auVar149._24_4_ = (uint)!(bool)((byte)(uVar92 >> 6) & 1) * auVar124._24_4_;
            auVar149._28_4_ = (uint)!SUB81(uVar92 >> 7,0) * auVar124._28_4_;
            bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar92 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar92 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar92 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar124 = vsubps_avx512vl(auVar149,auVar123);
            auVar127 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar108._12_4_ |
                                                     (uint)!bVar18 * auVar233._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar108._8_4_ |
                                                              (uint)!bVar16 * auVar233._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar108._4_4_ |
                                                                       (uint)!bVar14 *
                                                                       auVar233._4_4_,
                                                                       (uint)(bVar100 & 1) *
                                                                       (int)auVar108._0_4_ |
                                                                       (uint)!(bool)(bVar100 & 1) *
                                                                       auVar233._0_4_)))),auVar113);
            auVar125 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar218._12_4_ |
                                                     (uint)!bVar19 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar17 * (int)auVar218._8_4_ |
                                                              (uint)!bVar17 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar15 *
                                                                       (int)auVar218._4_4_ |
                                                                       (uint)!bVar15 * auVar6._4_4_,
                                                                       (uint)(bVar100 & 1) *
                                                                       (int)auVar218._0_4_ |
                                                                       (uint)!(bool)(bVar100 & 1) *
                                                                       auVar6._0_4_)))),auVar145);
            auVar115 = vsubps_avx(auVar123,auVar146);
            auVar117 = vsubps_avx(auVar113,auVar147);
            auVar118 = vsubps_avx(auVar145,auVar148);
            auVar67._4_4_ = auVar125._4_4_ * fVar157;
            auVar67._0_4_ = auVar125._0_4_ * fVar155;
            auVar67._8_4_ = auVar125._8_4_ * fVar160;
            auVar67._12_4_ = auVar125._12_4_ * fVar161;
            auVar67._16_4_ = auVar125._16_4_ * 0.0;
            auVar67._20_4_ = auVar125._20_4_ * 0.0;
            auVar67._24_4_ = auVar125._24_4_ * 0.0;
            auVar67._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar67,auVar145,auVar124);
            auVar189._0_4_ = fVar156 * auVar124._0_4_;
            auVar189._4_4_ = fVar159 * auVar124._4_4_;
            auVar189._8_4_ = fVar158 * auVar124._8_4_;
            auVar189._12_4_ = fVar162 * auVar124._12_4_;
            auVar189._16_4_ = auVar124._16_4_ * 0.0;
            auVar189._20_4_ = auVar124._20_4_ * 0.0;
            auVar189._24_4_ = auVar124._24_4_ * 0.0;
            auVar189._28_4_ = 0;
            auVar103 = vfmsub231ps_fma(auVar189,auVar123,auVar127);
            auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar122,ZEXT1632(auVar106));
            auVar201._0_4_ = auVar127._0_4_ * auVar145._0_4_;
            auVar201._4_4_ = auVar127._4_4_ * auVar145._4_4_;
            auVar201._8_4_ = auVar127._8_4_ * auVar145._8_4_;
            auVar201._12_4_ = auVar127._12_4_ * auVar145._12_4_;
            auVar201._16_4_ = auVar127._16_4_ * fVar192;
            auVar201._20_4_ = auVar127._20_4_ * fVar163;
            auVar201._24_4_ = auVar127._24_4_ * fVar205;
            auVar201._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar201,auVar113,auVar125);
            auVar119 = vfmadd231ps_avx512vl(auVar126,auVar122,ZEXT1632(auVar106));
            auVar126 = vmulps_avx512vl(auVar118,auVar146);
            auVar126 = vfmsub231ps_avx512vl(auVar126,auVar115,auVar148);
            auVar68._4_4_ = auVar117._4_4_ * auVar148._4_4_;
            auVar68._0_4_ = auVar117._0_4_ * auVar148._0_4_;
            auVar68._8_4_ = auVar117._8_4_ * auVar148._8_4_;
            auVar68._12_4_ = auVar117._12_4_ * auVar148._12_4_;
            auVar68._16_4_ = auVar117._16_4_ * fVar184;
            auVar68._20_4_ = auVar117._20_4_ * fVar101;
            auVar68._24_4_ = auVar117._24_4_ * fVar102;
            auVar68._28_4_ = iVar2;
            auVar106 = vfmsub231ps_fma(auVar68,auVar147,auVar118);
            auVar202._0_4_ = auVar147._0_4_ * auVar115._0_4_;
            auVar202._4_4_ = auVar147._4_4_ * auVar115._4_4_;
            auVar202._8_4_ = auVar147._8_4_ * auVar115._8_4_;
            auVar202._12_4_ = auVar147._12_4_ * auVar115._12_4_;
            auVar202._16_4_ = fVar185 * auVar115._16_4_;
            auVar202._20_4_ = fVar191 * auVar115._20_4_;
            auVar202._24_4_ = fVar206 * auVar115._24_4_;
            auVar202._28_4_ = 0;
            auVar103 = vfmsub231ps_fma(auVar202,auVar117,auVar146);
            auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar122,auVar126);
            auVar120 = vfmadd231ps_avx512vl(auVar126,auVar122,ZEXT1632(auVar106));
            auVar126 = vmaxps_avx(auVar119,auVar120);
            uVar165 = vcmpps_avx512vl(auVar126,auVar122,2);
            local_430 = local_430 & (byte)uVar165;
            auVar231 = ZEXT3264(auVar214);
            if (local_430 == 0) {
LAB_01d56f7d:
              local_430 = 0;
            }
            else {
              auVar69._4_4_ = auVar118._4_4_ * auVar127._4_4_;
              auVar69._0_4_ = auVar118._0_4_ * auVar127._0_4_;
              auVar69._8_4_ = auVar118._8_4_ * auVar127._8_4_;
              auVar69._12_4_ = auVar118._12_4_ * auVar127._12_4_;
              auVar69._16_4_ = auVar118._16_4_ * auVar127._16_4_;
              auVar69._20_4_ = auVar118._20_4_ * auVar127._20_4_;
              auVar69._24_4_ = auVar118._24_4_ * auVar127._24_4_;
              auVar69._28_4_ = auVar126._28_4_;
              auVar110 = vfmsub231ps_fma(auVar69,auVar117,auVar125);
              auVar70._4_4_ = auVar125._4_4_ * auVar115._4_4_;
              auVar70._0_4_ = auVar125._0_4_ * auVar115._0_4_;
              auVar70._8_4_ = auVar125._8_4_ * auVar115._8_4_;
              auVar70._12_4_ = auVar125._12_4_ * auVar115._12_4_;
              auVar70._16_4_ = auVar125._16_4_ * auVar115._16_4_;
              auVar70._20_4_ = auVar125._20_4_ * auVar115._20_4_;
              auVar70._24_4_ = auVar125._24_4_ * auVar115._24_4_;
              auVar70._28_4_ = auVar125._28_4_;
              auVar103 = vfmsub231ps_fma(auVar70,auVar124,auVar118);
              auVar71._4_4_ = auVar117._4_4_ * auVar124._4_4_;
              auVar71._0_4_ = auVar117._0_4_ * auVar124._0_4_;
              auVar71._8_4_ = auVar117._8_4_ * auVar124._8_4_;
              auVar71._12_4_ = auVar117._12_4_ * auVar124._12_4_;
              auVar71._16_4_ = auVar117._16_4_ * auVar124._16_4_;
              auVar71._20_4_ = auVar117._20_4_ * auVar124._20_4_;
              auVar71._24_4_ = auVar117._24_4_ * auVar124._24_4_;
              auVar71._28_4_ = auVar117._28_4_;
              auVar233 = vfmsub231ps_fma(auVar71,auVar115,auVar127);
              auVar106 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar103),ZEXT1632(auVar233));
              auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar106),ZEXT1632(auVar110),auVar122);
              auVar127 = vrcp14ps_avx512vl(auVar126);
              auVar33._8_4_ = 0x3f800000;
              auVar33._0_8_ = &DAT_3f8000003f800000;
              auVar33._12_4_ = 0x3f800000;
              auVar33._16_4_ = 0x3f800000;
              auVar33._20_4_ = 0x3f800000;
              auVar33._24_4_ = 0x3f800000;
              auVar33._28_4_ = 0x3f800000;
              auVar125 = vfnmadd213ps_avx512vl(auVar127,auVar126,auVar33);
              auVar106 = vfmadd132ps_fma(auVar125,auVar127,auVar127);
              auVar72._4_4_ = auVar233._4_4_ * auVar145._4_4_;
              auVar72._0_4_ = auVar233._0_4_ * auVar145._0_4_;
              auVar72._8_4_ = auVar233._8_4_ * auVar145._8_4_;
              auVar72._12_4_ = auVar233._12_4_ * auVar145._12_4_;
              auVar72._16_4_ = fVar192 * 0.0;
              auVar72._20_4_ = fVar163 * 0.0;
              auVar72._24_4_ = fVar205 * 0.0;
              auVar72._28_4_ = iVar1;
              auVar103 = vfmadd231ps_fma(auVar72,auVar113,ZEXT1632(auVar103));
              auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar123,ZEXT1632(auVar110));
              fVar192 = auVar106._0_4_;
              fVar163 = auVar106._4_4_;
              fVar205 = auVar106._8_4_;
              fVar206 = auVar106._12_4_;
              auVar127 = ZEXT1632(CONCAT412(auVar103._12_4_ * fVar206,
                                            CONCAT48(auVar103._8_4_ * fVar205,
                                                     CONCAT44(auVar103._4_4_ * fVar163,
                                                              auVar103._0_4_ * fVar192))));
              auVar89._4_4_ = uStack_59c;
              auVar89._0_4_ = local_5a0;
              auVar89._8_4_ = uStack_598;
              auVar89._12_4_ = uStack_594;
              auVar89._16_4_ = uStack_590;
              auVar89._20_4_ = uStack_58c;
              auVar89._24_4_ = uStack_588;
              auVar89._28_4_ = uStack_584;
              uVar165 = vcmpps_avx512vl(auVar127,auVar89,0xd);
              uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar34._4_4_ = uVar164;
              auVar34._0_4_ = uVar164;
              auVar34._8_4_ = uVar164;
              auVar34._12_4_ = uVar164;
              auVar34._16_4_ = uVar164;
              auVar34._20_4_ = uVar164;
              auVar34._24_4_ = uVar164;
              auVar34._28_4_ = uVar164;
              uVar22 = vcmpps_avx512vl(auVar127,auVar34,2);
              local_430 = (byte)uVar165 & (byte)uVar22 & local_430;
              if (local_430 == 0) goto LAB_01d56f7d;
              uVar165 = vcmpps_avx512vl(auVar126,auVar122,4);
              if ((local_430 & (byte)uVar165) == 0) {
                local_430 = 0;
              }
              else {
                local_430 = local_430 & (byte)uVar165;
                fVar185 = auVar119._0_4_ * fVar192;
                fVar191 = auVar119._4_4_ * fVar163;
                auVar73._4_4_ = fVar191;
                auVar73._0_4_ = fVar185;
                fVar101 = auVar119._8_4_ * fVar205;
                auVar73._8_4_ = fVar101;
                fVar102 = auVar119._12_4_ * fVar206;
                auVar73._12_4_ = fVar102;
                fVar184 = auVar119._16_4_ * 0.0;
                auVar73._16_4_ = fVar184;
                fVar155 = auVar119._20_4_ * 0.0;
                auVar73._20_4_ = fVar155;
                fVar156 = auVar119._24_4_ * 0.0;
                auVar73._24_4_ = fVar156;
                auVar73._28_4_ = auVar119._28_4_;
                fVar192 = auVar120._0_4_ * fVar192;
                fVar163 = auVar120._4_4_ * fVar163;
                auVar74._4_4_ = fVar163;
                auVar74._0_4_ = fVar192;
                fVar205 = auVar120._8_4_ * fVar205;
                auVar74._8_4_ = fVar205;
                fVar206 = auVar120._12_4_ * fVar206;
                auVar74._12_4_ = fVar206;
                fVar157 = auVar120._16_4_ * 0.0;
                auVar74._16_4_ = fVar157;
                fVar159 = auVar120._20_4_ * 0.0;
                auVar74._20_4_ = fVar159;
                fVar160 = auVar120._24_4_ * 0.0;
                auVar74._24_4_ = fVar160;
                auVar74._28_4_ = auVar120._28_4_;
                auVar210._8_4_ = 0x3f800000;
                auVar210._0_8_ = &DAT_3f8000003f800000;
                auVar210._12_4_ = 0x3f800000;
                auVar210._16_4_ = 0x3f800000;
                auVar210._20_4_ = 0x3f800000;
                auVar210._24_4_ = 0x3f800000;
                auVar210._28_4_ = 0x3f800000;
                auVar126 = vsubps_avx512vl(auVar210,auVar73);
                bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar92 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar92 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
                bVar20 = SUB81(uVar92 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar20 * auVar119._28_4_ |
                                              (uint)!bVar20 * auVar126._28_4_,
                                              CONCAT424((uint)bVar19 * (int)fVar156 |
                                                        (uint)!bVar19 * auVar126._24_4_,
                                                        CONCAT420((uint)bVar18 * (int)fVar155 |
                                                                  (uint)!bVar18 * auVar126._20_4_,
                                                                  CONCAT416((uint)bVar17 *
                                                                            (int)fVar184 |
                                                                            (uint)!bVar17 *
                                                                            auVar126._16_4_,
                                                                            CONCAT412((uint)bVar16 *
                                                                                      (int)fVar102 |
                                                                                      (uint)!bVar16
                                                                                      * auVar126.
                                                  _12_4_,CONCAT48((uint)bVar15 * (int)fVar101 |
                                                                  (uint)!bVar15 * auVar126._8_4_,
                                                                  CONCAT44((uint)bVar14 *
                                                                           (int)fVar191 |
                                                                           (uint)!bVar14 *
                                                                           auVar126._4_4_,
                                                                           (uint)(bVar100 & 1) *
                                                                           (int)fVar185 |
                                                                           (uint)!(bool)(bVar100 & 1
                                                                                        ) *
                                                                           auVar126._0_4_))))))));
                auVar126 = vsubps_avx(auVar210,auVar74);
                bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar92 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar92 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
                bVar20 = SUB81(uVar92 >> 7,0);
                local_380._4_4_ = (uint)bVar14 * (int)fVar163 | (uint)!bVar14 * auVar126._4_4_;
                local_380._0_4_ =
                     (uint)(bVar100 & 1) * (int)fVar192 |
                     (uint)!(bool)(bVar100 & 1) * auVar126._0_4_;
                local_380._8_4_ = (uint)bVar15 * (int)fVar205 | (uint)!bVar15 * auVar126._8_4_;
                local_380._12_4_ = (uint)bVar16 * (int)fVar206 | (uint)!bVar16 * auVar126._12_4_;
                local_380._16_4_ = (uint)bVar17 * (int)fVar157 | (uint)!bVar17 * auVar126._16_4_;
                local_380._20_4_ = (uint)bVar18 * (int)fVar159 | (uint)!bVar18 * auVar126._20_4_;
                local_380._24_4_ = (uint)bVar19 * (int)fVar160 | (uint)!bVar19 * auVar126._24_4_;
                local_380._28_4_ = (uint)bVar20 * auVar120._28_4_ | (uint)!bVar20 * auVar126._28_4_;
                in_ZMM21 = ZEXT3264(auVar127);
              }
            }
            auVar229 = ZEXT3264(local_700);
            if (local_430 != 0) {
              auVar126 = vsubps_avx(ZEXT1632(auVar105),auVar111);
              local_640 = in_ZMM20._0_32_;
              auVar126 = vfmadd213ps_avx512vl(auVar126,local_640,auVar111);
              auVar172._0_4_ = auVar126._0_4_ + auVar126._0_4_;
              auVar172._4_4_ = auVar126._4_4_ + auVar126._4_4_;
              auVar172._8_4_ = auVar126._8_4_ + auVar126._8_4_;
              auVar172._12_4_ = auVar126._12_4_ + auVar126._12_4_;
              auVar172._16_4_ = auVar126._16_4_ + auVar126._16_4_;
              auVar172._20_4_ = auVar126._20_4_ + auVar126._20_4_;
              auVar172._24_4_ = auVar126._24_4_ + auVar126._24_4_;
              auVar172._28_4_ = auVar126._28_4_ + auVar126._28_4_;
              uVar164 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar35._4_4_ = uVar164;
              auVar35._0_4_ = uVar164;
              auVar35._8_4_ = uVar164;
              auVar35._12_4_ = uVar164;
              auVar35._16_4_ = uVar164;
              auVar35._20_4_ = uVar164;
              auVar35._24_4_ = uVar164;
              auVar35._28_4_ = uVar164;
              auVar126 = vmulps_avx512vl(auVar172,auVar35);
              local_660 = in_ZMM21._0_32_;
              uVar165 = vcmpps_avx512vl(local_660,auVar126,6);
              local_430 = local_430 & (byte)uVar165;
              if (local_430 != 0) {
                auVar173._8_4_ = 0xbf800000;
                auVar173._0_8_ = 0xbf800000bf800000;
                auVar173._12_4_ = 0xbf800000;
                auVar173._16_4_ = 0xbf800000;
                auVar173._20_4_ = 0xbf800000;
                auVar173._24_4_ = 0xbf800000;
                auVar173._28_4_ = 0xbf800000;
                auVar36._8_4_ = 0x40000000;
                auVar36._0_8_ = 0x4000000040000000;
                auVar36._12_4_ = 0x40000000;
                auVar36._16_4_ = 0x40000000;
                auVar36._20_4_ = 0x40000000;
                auVar36._24_4_ = 0x40000000;
                auVar36._28_4_ = 0x40000000;
                local_4c0 = vfmadd132ps_avx512vl(local_380,auVar173,auVar36);
                local_380 = local_4c0;
                auVar126 = local_380;
                local_480 = (undefined4)lVar97;
                local_460 = local_6b0._0_8_;
                uStack_458 = local_6b0._8_8_;
                local_450 = local_6c0._0_8_;
                uStack_448 = local_6c0._8_8_;
                local_440 = local_6d0;
                uStack_438 = uStack_6c8;
                pGVar11 = (context->scene->geometries).items[uVar98].ptr;
                local_380 = auVar126;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar126 = vaddps_avx512vl(local_640,_DAT_02020f40);
                  auVar106 = vcvtsi2ss_avx512f(auVar230._0_16_,local_480);
                  fVar192 = auVar106._0_4_;
                  local_420[0] = (fVar192 + auVar126._0_4_) * (float)local_5c0._0_4_;
                  local_420[1] = (fVar192 + auVar126._4_4_) * (float)local_5c0._4_4_;
                  local_420[2] = (fVar192 + auVar126._8_4_) * fStack_5b8;
                  local_420[3] = (fVar192 + auVar126._12_4_) * fStack_5b4;
                  fStack_410 = (fVar192 + auVar126._16_4_) * fStack_5b0;
                  fStack_40c = (fVar192 + auVar126._20_4_) * fStack_5ac;
                  fStack_408 = (fVar192 + auVar126._24_4_) * fStack_5a8;
                  fStack_404 = fVar192 + auVar126._28_4_;
                  local_380._0_8_ = local_4c0._0_8_;
                  local_380._8_8_ = local_4c0._8_8_;
                  local_380._16_8_ = local_4c0._16_8_;
                  local_380._24_8_ = local_4c0._24_8_;
                  local_400 = local_380._0_8_;
                  uStack_3f8 = local_380._8_8_;
                  uStack_3f0 = local_380._16_8_;
                  uStack_3e8 = local_380._24_8_;
                  local_3e0 = local_660;
                  auVar174._8_4_ = 0x7f800000;
                  auVar174._0_8_ = 0x7f8000007f800000;
                  auVar174._12_4_ = 0x7f800000;
                  auVar174._16_4_ = 0x7f800000;
                  auVar174._20_4_ = 0x7f800000;
                  auVar174._24_4_ = 0x7f800000;
                  auVar174._28_4_ = 0x7f800000;
                  auVar126 = vblendmps_avx512vl(auVar174,local_660);
                  auVar150._0_4_ =
                       (uint)(local_430 & 1) * auVar126._0_4_ |
                       (uint)!(bool)(local_430 & 1) * 0x7f800000;
                  bVar14 = (bool)(local_430 >> 1 & 1);
                  auVar150._4_4_ = (uint)bVar14 * auVar126._4_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_430 >> 2 & 1);
                  auVar150._8_4_ = (uint)bVar14 * auVar126._8_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_430 >> 3 & 1);
                  auVar150._12_4_ = (uint)bVar14 * auVar126._12_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_430 >> 4 & 1);
                  auVar150._16_4_ = (uint)bVar14 * auVar126._16_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_430 >> 5 & 1);
                  auVar150._20_4_ = (uint)bVar14 * auVar126._20_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_430 >> 6 & 1);
                  auVar150._24_4_ = (uint)bVar14 * auVar126._24_4_ | (uint)!bVar14 * 0x7f800000;
                  auVar150._28_4_ =
                       (uint)(local_430 >> 7) * auVar126._28_4_ |
                       (uint)!(bool)(local_430 >> 7) * 0x7f800000;
                  auVar126 = vshufps_avx(auVar150,auVar150,0xb1);
                  auVar126 = vminps_avx(auVar150,auVar126);
                  auVar127 = vshufpd_avx(auVar126,auVar126,5);
                  auVar126 = vminps_avx(auVar126,auVar127);
                  auVar127 = vpermpd_avx2(auVar126,0x4e);
                  auVar126 = vminps_avx(auVar126,auVar127);
                  uVar165 = vcmpps_avx512vl(auVar150,auVar126,0);
                  bVar91 = (byte)uVar165 & local_430;
                  bVar100 = local_430;
                  if (bVar91 != 0) {
                    bVar100 = bVar91;
                  }
                  uVar219 = 0;
                  for (uVar94 = (uint)bVar100; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000)
                  {
                    uVar219 = uVar219 + 1;
                  }
                  uVar92 = (ulong)uVar219;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar192 = local_420[uVar92];
                    uVar164 = *(undefined4 *)((long)&local_400 + uVar92 * 4);
                    fVar163 = 1.0 - fVar192;
                    auVar25._8_4_ = 0x80000000;
                    auVar25._0_8_ = 0x8000000080000000;
                    auVar25._12_4_ = 0x80000000;
                    auVar103 = vxorps_avx512vl(ZEXT416((uint)fVar163),auVar25);
                    auVar106 = ZEXT416((uint)(fVar192 * fVar163 * 4.0));
                    auVar105 = vfnmsub213ss_fma(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),
                                                auVar106);
                    auVar106 = vfmadd213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),
                                               auVar106);
                    fVar163 = fVar163 * auVar103._0_4_ * 0.5;
                    fVar205 = auVar105._0_4_ * 0.5;
                    fVar206 = auVar106._0_4_ * 0.5;
                    fVar185 = fVar192 * fVar192 * 0.5;
                    auVar195._0_4_ = fVar185 * (float)local_6d0._0_4_;
                    auVar195._4_4_ = fVar185 * (float)local_6d0._4_4_;
                    auVar195._8_4_ = fVar185 * (float)uStack_6c8;
                    auVar195._12_4_ = fVar185 * uStack_6c8._4_4_;
                    auVar182._4_4_ = fVar206;
                    auVar182._0_4_ = fVar206;
                    auVar182._8_4_ = fVar206;
                    auVar182._12_4_ = fVar206;
                    auVar106 = vfmadd132ps_fma(auVar182,auVar195,local_6c0);
                    auVar196._4_4_ = fVar205;
                    auVar196._0_4_ = fVar205;
                    auVar196._8_4_ = fVar205;
                    auVar196._12_4_ = fVar205;
                    auVar106 = vfmadd132ps_fma(auVar196,auVar106,local_6b0);
                    auVar183._4_4_ = fVar163;
                    auVar183._0_4_ = fVar163;
                    auVar183._8_4_ = fVar163;
                    auVar183._12_4_ = fVar163;
                    auVar106 = vfmadd213ps_fma(auVar183,auVar21,auVar106);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar92 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar106._0_4_;
                    uVar10 = vextractps_avx(auVar106,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar10;
                    uVar10 = vextractps_avx(auVar106,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar10;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar192;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar164;
                    *(undefined4 *)(ray + k * 4 + 0x220) = uVar3;
                    *(uint *)(ray + k * 4 + 0x240) = uVar98;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    local_5e0 = local_6b0._0_8_;
                    uStack_5d8 = local_6b0._8_8_;
                    local_5f0 = local_6c0._0_4_;
                    fStack_5ec = local_6c0._4_4_;
                    fStack_5e8 = local_6c0._8_4_;
                    fStack_5e4 = local_6c0._12_4_;
                    local_310 = local_6d0;
                    uStack_308 = uStack_6c8;
                    local_710 = lVar97;
                    local_4e0 = local_640;
                    local_4a0 = local_660;
                    local_47c = iVar9;
                    local_470 = auVar21;
                    bVar100 = local_430;
                    do {
                      auVar126 = local_3c0;
                      local_3c0._1_3_ = 0;
                      local_3c0[0] = bVar100;
                      auVar110 = auVar234._0_16_;
                      local_3c0._4_28_ = auVar126._4_28_;
                      local_5d0 = *(undefined4 *)(ray + k * 4 + 0x100);
                      fVar192 = local_420[uVar92];
                      auVar177._4_4_ = fVar192;
                      auVar177._0_4_ = fVar192;
                      auVar177._8_4_ = fVar192;
                      auVar177._12_4_ = fVar192;
                      local_280._16_4_ = fVar192;
                      local_280._0_16_ = auVar177;
                      local_280._20_4_ = fVar192;
                      local_280._24_4_ = fVar192;
                      local_280._28_4_ = fVar192;
                      local_260 = *(undefined4 *)((long)&local_400 + uVar92 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar92 * 4)
                      ;
                      local_740.context = context->user;
                      fVar163 = 1.0 - fVar192;
                      auVar26._8_4_ = 0x80000000;
                      auVar26._0_8_ = 0x8000000080000000;
                      auVar26._12_4_ = 0x80000000;
                      auVar103 = vxorps_avx512vl(ZEXT416((uint)fVar163),auVar26);
                      auVar106 = ZEXT416((uint)(fVar192 * fVar163 * 4.0));
                      auVar105 = vfnmsub213ss_fma(auVar177,auVar177,auVar106);
                      auVar106 = vfmadd213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),
                                                 auVar106);
                      fVar163 = fVar163 * auVar103._0_4_ * 0.5;
                      fVar205 = auVar105._0_4_ * 0.5;
                      fVar206 = auVar106._0_4_ * 0.5;
                      fVar192 = fVar192 * fVar192 * 0.5;
                      auVar207._0_4_ = fVar192 * (float)local_310;
                      auVar207._4_4_ = fVar192 * local_310._4_4_;
                      auVar207._8_4_ = fVar192 * (float)uStack_308;
                      auVar207._12_4_ = fVar192 * uStack_308._4_4_;
                      auVar166._4_4_ = fVar206;
                      auVar166._0_4_ = fVar206;
                      auVar166._8_4_ = fVar206;
                      auVar166._12_4_ = fVar206;
                      auVar85._4_4_ = fStack_5ec;
                      auVar85._0_4_ = local_5f0;
                      auVar85._8_4_ = fStack_5e8;
                      auVar85._12_4_ = fStack_5e4;
                      auVar106 = vfmadd132ps_fma(auVar166,auVar207,auVar85);
                      auVar197._4_4_ = fVar205;
                      auVar197._0_4_ = fVar205;
                      auVar197._8_4_ = fVar205;
                      auVar197._12_4_ = fVar205;
                      auVar86._8_8_ = uStack_5d8;
                      auVar86._0_8_ = local_5e0;
                      auVar106 = vfmadd132ps_fma(auVar197,auVar106,auVar86);
                      auVar167._4_4_ = fVar163;
                      auVar167._0_4_ = fVar163;
                      auVar167._8_4_ = fVar163;
                      auVar167._12_4_ = fVar163;
                      auVar106 = vfmadd213ps_fma(auVar167,auVar21,auVar106);
                      local_2e0 = auVar106._0_4_;
                      auVar203._8_4_ = 1;
                      auVar203._0_8_ = 0x100000001;
                      auVar203._12_4_ = 1;
                      auVar203._16_4_ = 1;
                      auVar203._20_4_ = 1;
                      auVar203._24_4_ = 1;
                      auVar203._28_4_ = 1;
                      local_2c0 = vpermps_avx2(auVar203,ZEXT1632(auVar106));
                      auVar211._8_4_ = 2;
                      auVar211._0_8_ = 0x200000002;
                      auVar211._12_4_ = 2;
                      auVar211._16_4_ = 2;
                      auVar211._20_4_ = 2;
                      auVar211._24_4_ = 2;
                      auVar211._28_4_ = 2;
                      local_2a0 = vpermps_avx2(auVar211,ZEXT1632(auVar106));
                      iStack_2dc = local_2e0;
                      iStack_2d8 = local_2e0;
                      iStack_2d4 = local_2e0;
                      iStack_2d0 = local_2e0;
                      iStack_2cc = local_2e0;
                      iStack_2c8 = local_2e0;
                      iStack_2c4 = local_2e0;
                      uStack_25c = local_260;
                      uStack_258 = local_260;
                      uStack_254 = local_260;
                      uStack_250 = local_260;
                      uStack_24c = local_260;
                      uStack_248 = local_260;
                      uStack_244 = local_260;
                      local_240 = local_3a0._0_8_;
                      uStack_238 = local_3a0._8_8_;
                      uStack_230 = local_3a0._16_8_;
                      uStack_228 = local_3a0._24_8_;
                      local_220 = local_500;
                      auVar126 = vpcmpeqd_avx2(local_500,local_500);
                      local_708[1] = auVar126;
                      *local_708 = auVar126;
                      local_200 = (local_740.context)->instID[0];
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = (local_740.context)->instPrimID[0];
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_620 = local_300._0_8_;
                      uStack_618 = local_300._8_8_;
                      uStack_610 = local_300._16_8_;
                      uStack_608 = local_300._24_8_;
                      local_740.valid = (int *)&local_620;
                      local_740.geometryUserPtr = pGVar11->userPtr;
                      local_740.hit = (RTCHitN *)&local_2e0;
                      local_740.N = 8;
                      local_740.ray = (RTCRayN *)ray;
                      if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar11->intersectionFilterN)(&local_740);
                        auVar236 = ZEXT3264(local_6a0);
                        auVar235 = ZEXT3264(local_680);
                        auVar229 = ZEXT3264(local_700);
                        auVar231 = ZEXT3264(local_560);
                        auVar232 = ZEXT3264(local_540);
                        in_ZMM21 = ZEXT3264(local_660);
                        in_ZMM20 = ZEXT3264(local_640);
                        auVar106 = vxorps_avx512vl(auVar110,auVar110);
                        auVar234 = ZEXT1664(auVar106);
                        lVar97 = local_710;
                      }
                      auVar106 = auVar234._0_16_;
                      auVar81._8_8_ = uStack_618;
                      auVar81._0_8_ = local_620;
                      auVar81._16_8_ = uStack_610;
                      auVar81._24_8_ = uStack_608;
                      if (auVar81 == (undefined1  [32])0x0) {
LAB_01d573be:
                        *(undefined4 *)(ray + k * 4 + 0x100) = local_5d0;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_740);
                          auVar236 = ZEXT3264(local_6a0);
                          auVar235 = ZEXT3264(local_680);
                          auVar229 = ZEXT3264(local_700);
                          auVar231 = ZEXT3264(local_560);
                          auVar232 = ZEXT3264(local_540);
                          in_ZMM21 = ZEXT3264(local_660);
                          in_ZMM20 = ZEXT3264(local_640);
                          auVar106 = vxorps_avx512vl(auVar106,auVar106);
                          auVar234 = ZEXT1664(auVar106);
                          lVar97 = local_710;
                        }
                        auVar82._8_8_ = uStack_618;
                        auVar82._0_8_ = local_620;
                        auVar82._16_8_ = uStack_610;
                        auVar82._24_8_ = uStack_608;
                        if (auVar82 == (undefined1  [32])0x0) goto LAB_01d573be;
                        uVar96 = vptestmd_avx512vl(auVar82,auVar82);
                        iVar1 = *(int *)(local_740.hit + 4);
                        iVar2 = *(int *)(local_740.hit + 8);
                        iVar76 = *(int *)(local_740.hit + 0xc);
                        iVar77 = *(int *)(local_740.hit + 0x10);
                        iVar78 = *(int *)(local_740.hit + 0x14);
                        iVar79 = *(int *)(local_740.hit + 0x18);
                        iVar80 = *(int *)(local_740.hit + 0x1c);
                        bVar100 = (byte)uVar96;
                        bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
                        bVar20 = SUB81(uVar96 >> 7,0);
                        *(uint *)(local_740.ray + 0x180) =
                             (uint)(bVar100 & 1) * *(int *)local_740.hit |
                             (uint)!(bool)(bVar100 & 1) * *(int *)(local_740.ray + 0x180);
                        *(uint *)(local_740.ray + 0x184) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_740.ray + 0x184);
                        *(uint *)(local_740.ray + 0x188) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_740.ray + 0x188);
                        *(uint *)(local_740.ray + 0x18c) =
                             (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_740.ray + 0x18c)
                        ;
                        *(uint *)(local_740.ray + 400) =
                             (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_740.ray + 400);
                        *(uint *)(local_740.ray + 0x194) =
                             (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_740.ray + 0x194)
                        ;
                        *(uint *)(local_740.ray + 0x198) =
                             (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_740.ray + 0x198)
                        ;
                        *(uint *)(local_740.ray + 0x19c) =
                             (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_740.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_740.hit + 0x24);
                        iVar2 = *(int *)(local_740.hit + 0x28);
                        iVar76 = *(int *)(local_740.hit + 0x2c);
                        iVar77 = *(int *)(local_740.hit + 0x30);
                        iVar78 = *(int *)(local_740.hit + 0x34);
                        iVar79 = *(int *)(local_740.hit + 0x38);
                        iVar80 = *(int *)(local_740.hit + 0x3c);
                        bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
                        bVar20 = SUB81(uVar96 >> 7,0);
                        *(uint *)(local_740.ray + 0x1a0) =
                             (uint)(bVar100 & 1) * *(int *)(local_740.hit + 0x20) |
                             (uint)!(bool)(bVar100 & 1) * *(int *)(local_740.ray + 0x1a0);
                        *(uint *)(local_740.ray + 0x1a4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_740.ray + 0x1a4);
                        *(uint *)(local_740.ray + 0x1a8) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_740.ray + 0x1a8);
                        *(uint *)(local_740.ray + 0x1ac) =
                             (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_740.ray + 0x1ac)
                        ;
                        *(uint *)(local_740.ray + 0x1b0) =
                             (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_740.ray + 0x1b0)
                        ;
                        *(uint *)(local_740.ray + 0x1b4) =
                             (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_740.ray + 0x1b4)
                        ;
                        *(uint *)(local_740.ray + 0x1b8) =
                             (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_740.ray + 0x1b8)
                        ;
                        *(uint *)(local_740.ray + 0x1bc) =
                             (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_740.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_740.hit + 0x44);
                        iVar2 = *(int *)(local_740.hit + 0x48);
                        iVar76 = *(int *)(local_740.hit + 0x4c);
                        iVar77 = *(int *)(local_740.hit + 0x50);
                        iVar78 = *(int *)(local_740.hit + 0x54);
                        iVar79 = *(int *)(local_740.hit + 0x58);
                        iVar80 = *(int *)(local_740.hit + 0x5c);
                        bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
                        bVar20 = SUB81(uVar96 >> 7,0);
                        *(uint *)(local_740.ray + 0x1c0) =
                             (uint)(bVar100 & 1) * *(int *)(local_740.hit + 0x40) |
                             (uint)!(bool)(bVar100 & 1) * *(int *)(local_740.ray + 0x1c0);
                        *(uint *)(local_740.ray + 0x1c4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_740.ray + 0x1c4);
                        *(uint *)(local_740.ray + 0x1c8) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_740.ray + 0x1c8);
                        *(uint *)(local_740.ray + 0x1cc) =
                             (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_740.ray + 0x1cc)
                        ;
                        *(uint *)(local_740.ray + 0x1d0) =
                             (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_740.ray + 0x1d0)
                        ;
                        *(uint *)(local_740.ray + 0x1d4) =
                             (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_740.ray + 0x1d4)
                        ;
                        *(uint *)(local_740.ray + 0x1d8) =
                             (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_740.ray + 0x1d8)
                        ;
                        *(uint *)(local_740.ray + 0x1dc) =
                             (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_740.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_740.hit + 100);
                        iVar2 = *(int *)(local_740.hit + 0x68);
                        iVar76 = *(int *)(local_740.hit + 0x6c);
                        iVar77 = *(int *)(local_740.hit + 0x70);
                        iVar78 = *(int *)(local_740.hit + 0x74);
                        iVar79 = *(int *)(local_740.hit + 0x78);
                        iVar80 = *(int *)(local_740.hit + 0x7c);
                        bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
                        bVar20 = SUB81(uVar96 >> 7,0);
                        *(uint *)(local_740.ray + 0x1e0) =
                             (uint)(bVar100 & 1) * *(int *)(local_740.hit + 0x60) |
                             (uint)!(bool)(bVar100 & 1) * *(int *)(local_740.ray + 0x1e0);
                        *(uint *)(local_740.ray + 0x1e4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_740.ray + 0x1e4);
                        *(uint *)(local_740.ray + 0x1e8) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_740.ray + 0x1e8);
                        *(uint *)(local_740.ray + 0x1ec) =
                             (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_740.ray + 0x1ec)
                        ;
                        *(uint *)(local_740.ray + 0x1f0) =
                             (uint)bVar17 * iVar77 | (uint)!bVar17 * *(int *)(local_740.ray + 0x1f0)
                        ;
                        *(uint *)(local_740.ray + 500) =
                             (uint)bVar18 * iVar78 | (uint)!bVar18 * *(int *)(local_740.ray + 500);
                        *(uint *)(local_740.ray + 0x1f8) =
                             (uint)bVar19 * iVar79 | (uint)!bVar19 * *(int *)(local_740.ray + 0x1f8)
                        ;
                        *(uint *)(local_740.ray + 0x1fc) =
                             (uint)bVar20 * iVar80 | (uint)!bVar20 * *(int *)(local_740.ray + 0x1fc)
                        ;
                        auVar151._0_4_ =
                             (uint)(bVar100 & 1) * *(int *)(local_740.hit + 0x80) |
                             (uint)!(bool)(bVar100 & 1) * *(int *)(local_740.ray + 0x200);
                        bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                        auVar151._4_4_ =
                             (uint)bVar14 * *(int *)(local_740.hit + 0x84) |
                             (uint)!bVar14 * *(int *)(local_740.ray + 0x204);
                        bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
                        auVar151._8_4_ =
                             (uint)bVar14 * *(int *)(local_740.hit + 0x88) |
                             (uint)!bVar14 * *(int *)(local_740.ray + 0x208);
                        bVar14 = (bool)((byte)(uVar96 >> 3) & 1);
                        auVar151._12_4_ =
                             (uint)bVar14 * *(int *)(local_740.hit + 0x8c) |
                             (uint)!bVar14 * *(int *)(local_740.ray + 0x20c);
                        bVar14 = (bool)((byte)(uVar96 >> 4) & 1);
                        auVar151._16_4_ =
                             (uint)bVar14 * *(int *)(local_740.hit + 0x90) |
                             (uint)!bVar14 * *(int *)(local_740.ray + 0x210);
                        bVar14 = (bool)((byte)(uVar96 >> 5) & 1);
                        auVar151._20_4_ =
                             (uint)bVar14 * *(int *)(local_740.hit + 0x94) |
                             (uint)!bVar14 * *(int *)(local_740.ray + 0x214);
                        bVar14 = (bool)((byte)(uVar96 >> 6) & 1);
                        auVar151._24_4_ =
                             (uint)bVar14 * *(int *)(local_740.hit + 0x98) |
                             (uint)!bVar14 * *(int *)(local_740.ray + 0x218);
                        bVar14 = SUB81(uVar96 >> 7,0);
                        auVar151._28_4_ =
                             (uint)bVar14 * *(int *)(local_740.hit + 0x9c) |
                             (uint)!bVar14 * *(int *)(local_740.ray + 0x21c);
                        *(undefined1 (*) [32])(local_740.ray + 0x200) = auVar151;
                        auVar126 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_740.hit + 0xa0));
                        *(undefined1 (*) [32])(local_740.ray + 0x220) = auVar126;
                        auVar126 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_740.hit + 0xc0));
                        *(undefined1 (*) [32])(local_740.ray + 0x240) = auVar126;
                        auVar126 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_740.hit + 0xe0));
                        *(undefined1 (*) [32])(local_740.ray + 0x260) = auVar126;
                        auVar126 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_740.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_740.ray + 0x280) = auVar126;
                      }
                      bVar91 = ~(byte)(1 << ((uint)uVar92 & 0x1f)) & local_3c0[0];
                      uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar37._4_4_ = uVar164;
                      auVar37._0_4_ = uVar164;
                      auVar37._8_4_ = uVar164;
                      auVar37._12_4_ = uVar164;
                      auVar37._16_4_ = uVar164;
                      auVar37._20_4_ = uVar164;
                      auVar37._24_4_ = uVar164;
                      auVar37._28_4_ = uVar164;
                      uVar165 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar37,2);
                      bVar100 = bVar91 & (byte)uVar165;
                      if ((bVar91 & (byte)uVar165) != 0) {
                        auVar175._8_4_ = 0x7f800000;
                        auVar175._0_8_ = 0x7f8000007f800000;
                        auVar175._12_4_ = 0x7f800000;
                        auVar175._16_4_ = 0x7f800000;
                        auVar175._20_4_ = 0x7f800000;
                        auVar175._24_4_ = 0x7f800000;
                        auVar175._28_4_ = 0x7f800000;
                        auVar126 = vblendmps_avx512vl(auVar175,in_ZMM21._0_32_);
                        auVar152._0_4_ =
                             (uint)(bVar100 & 1) * auVar126._0_4_ |
                             (uint)!(bool)(bVar100 & 1) * 0x7f800000;
                        bVar14 = (bool)(bVar100 >> 1 & 1);
                        auVar152._4_4_ = (uint)bVar14 * auVar126._4_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar100 >> 2 & 1);
                        auVar152._8_4_ = (uint)bVar14 * auVar126._8_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar100 >> 3 & 1);
                        auVar152._12_4_ =
                             (uint)bVar14 * auVar126._12_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar100 >> 4 & 1);
                        auVar152._16_4_ =
                             (uint)bVar14 * auVar126._16_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar100 >> 5 & 1);
                        auVar152._20_4_ =
                             (uint)bVar14 * auVar126._20_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar100 >> 6 & 1);
                        auVar152._24_4_ =
                             (uint)bVar14 * auVar126._24_4_ | (uint)!bVar14 * 0x7f800000;
                        auVar152._28_4_ =
                             (uint)(bVar100 >> 7) * auVar126._28_4_ |
                             (uint)!(bool)(bVar100 >> 7) * 0x7f800000;
                        auVar126 = vshufps_avx(auVar152,auVar152,0xb1);
                        auVar126 = vminps_avx(auVar152,auVar126);
                        auVar127 = vshufpd_avx(auVar126,auVar126,5);
                        auVar126 = vminps_avx(auVar126,auVar127);
                        auVar127 = vpermpd_avx2(auVar126,0x4e);
                        auVar126 = vminps_avx(auVar126,auVar127);
                        uVar165 = vcmpps_avx512vl(auVar152,auVar126,0);
                        bVar90 = (byte)uVar165 & bVar100;
                        bVar91 = bVar100;
                        if (bVar90 != 0) {
                          bVar91 = bVar90;
                        }
                        uVar219 = 0;
                        for (uVar94 = (uint)bVar91; (uVar94 & 1) == 0;
                            uVar94 = uVar94 >> 1 | 0x80000000) {
                          uVar219 = uVar219 + 1;
                        }
                        uVar92 = (ulong)uVar219;
                      }
                    } while (bVar100 != 0);
                  }
                }
              }
            }
          }
          auVar215 = ZEXT3264(auVar114);
          auVar190 = ZEXT3264(auVar116);
          lVar97 = lVar97 + 8;
          auVar230 = auVar231;
        } while ((int)lVar97 < iVar9);
      }
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar32._4_4_ = uVar3;
      auVar32._0_4_ = uVar3;
      auVar32._8_4_ = uVar3;
      auVar32._12_4_ = uVar3;
      auVar32._16_4_ = uVar3;
      auVar32._20_4_ = uVar3;
      auVar32._24_4_ = uVar3;
      auVar32._28_4_ = uVar3;
      uVar165 = vcmpps_avx512vl(local_80,auVar32,2);
      uVar98 = (uint)uVar99 & (uint)uVar165;
      uVar99 = (ulong)uVar98;
    } while (uVar98 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }